

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  int iVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  long lVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined4 uVar69;
  undefined8 in_R10;
  float t1;
  float fVar70;
  float fVar71;
  float fVar93;
  float fVar95;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar94;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined8 uVar96;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar113;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar147;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vfloat4 b0;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar162;
  float fVar181;
  float fVar182;
  vfloat4 b0_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar183;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar193;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar186 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar194;
  undefined1 auVar192 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar198;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar211;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar212;
  float fVar228;
  vfloat4 a0_2;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar229;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  vfloat4 a0_3;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar259;
  float fVar260;
  vfloat4 a0_1;
  undefined1 auVar250 [16];
  undefined1 auVar247 [16];
  float fVar261;
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar249 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  vfloat4 a0;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar285 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_740 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [32];
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint auStack_510 [4];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  uint uStack_3a0;
  float afStack_39c [7];
  undefined1 local_380 [32];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar62;
  undefined1 auVar284 [32];
  
  PVar8 = prim[1];
  uVar66 = (ulong)(byte)PVar8;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  fVar70 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar72._0_4_ = fVar70 * auVar15._0_4_;
  auVar72._4_4_ = fVar70 * auVar15._4_4_;
  auVar72._8_4_ = fVar70 * auVar15._8_4_;
  auVar72._12_4_ = fVar70 * auVar15._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar15);
  auVar250._0_4_ = fVar70 * auVar16._0_4_;
  auVar250._4_4_ = fVar70 * auVar16._4_4_;
  auVar250._8_4_ = fVar70 * auVar16._8_4_;
  auVar250._12_4_ = fVar70 * auVar16._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar17 = vpmovsxbd_avx2(auVar16);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar18 = vpmovsxbd_avx2(auVar131);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar19 = vpmovsxbd_avx2(auVar3);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar66 * 0xc + 6);
  auVar20 = vpmovsxbd_avx2(auVar4);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar21 = vpmovsxbd_avx2(auVar5);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar22 = vpmovsxbd_avx2(auVar6);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar66 * 0x13 + 6);
  auVar23 = vpmovsxbd_avx2(auVar214);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar258 = vpmovsxbd_avx2(auVar7);
  auVar14 = vcvtdq2ps_avx(auVar23);
  auVar258 = vcvtdq2ps_avx(auVar258);
  auVar269._4_4_ = auVar250._0_4_;
  auVar269._0_4_ = auVar250._0_4_;
  auVar269._8_4_ = auVar250._0_4_;
  auVar269._12_4_ = auVar250._0_4_;
  auVar269._16_4_ = auVar250._0_4_;
  auVar269._20_4_ = auVar250._0_4_;
  auVar269._24_4_ = auVar250._0_4_;
  auVar269._28_4_ = auVar250._0_4_;
  auVar15 = vmovshdup_avx(auVar250);
  uVar96 = auVar15._0_8_;
  auVar282._8_8_ = uVar96;
  auVar282._0_8_ = uVar96;
  auVar282._16_8_ = uVar96;
  auVar282._24_8_ = uVar96;
  auVar15 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar70 = auVar15._0_4_;
  auVar227._0_4_ = fVar70 * auVar18._0_4_;
  fVar93 = auVar15._4_4_;
  auVar227._4_4_ = fVar93 * auVar18._4_4_;
  auVar227._8_4_ = fVar70 * auVar18._8_4_;
  auVar227._12_4_ = fVar93 * auVar18._12_4_;
  auVar227._16_4_ = fVar70 * auVar18._16_4_;
  auVar227._20_4_ = fVar93 * auVar18._20_4_;
  auVar227._28_36_ = in_ZMM10._28_36_;
  auVar227._24_4_ = fVar70 * auVar18._24_4_;
  auVar25._4_4_ = auVar21._4_4_ * fVar93;
  auVar25._0_4_ = auVar21._0_4_ * fVar70;
  auVar25._8_4_ = auVar21._8_4_ * fVar70;
  auVar25._12_4_ = auVar21._12_4_ * fVar93;
  auVar25._16_4_ = auVar21._16_4_ * fVar70;
  auVar25._20_4_ = auVar21._20_4_ * fVar93;
  auVar25._24_4_ = auVar21._24_4_ * fVar70;
  auVar25._28_4_ = auVar23._28_4_;
  auVar207._0_4_ = auVar258._0_4_ * fVar70;
  auVar207._4_4_ = auVar258._4_4_ * fVar93;
  auVar207._8_4_ = auVar258._8_4_ * fVar70;
  auVar207._12_4_ = auVar258._12_4_ * fVar93;
  auVar207._16_4_ = auVar258._16_4_ * fVar70;
  auVar207._20_4_ = auVar258._20_4_ * fVar93;
  auVar207._24_4_ = auVar258._24_4_ * fVar70;
  auVar207._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(auVar227._0_32_,auVar282,auVar17);
  auVar16 = vfmadd231ps_fma(auVar25,auVar282,auVar20);
  auVar131 = vfmadd231ps_fma(auVar207,auVar14,auVar282);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar269,auVar87);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar269,auVar19);
  auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),auVar22,auVar269);
  auVar270._4_4_ = auVar72._0_4_;
  auVar270._0_4_ = auVar72._0_4_;
  auVar270._8_4_ = auVar72._0_4_;
  auVar270._12_4_ = auVar72._0_4_;
  auVar270._16_4_ = auVar72._0_4_;
  auVar270._20_4_ = auVar72._0_4_;
  auVar270._24_4_ = auVar72._0_4_;
  auVar270._28_4_ = auVar72._0_4_;
  auVar15 = vmovshdup_avx(auVar72);
  uVar96 = auVar15._0_8_;
  auVar283._8_8_ = uVar96;
  auVar283._0_8_ = uVar96;
  auVar283._16_8_ = uVar96;
  auVar283._24_8_ = uVar96;
  auVar15 = vshufps_avx(auVar72,auVar72,0xaa);
  fVar70 = auVar15._0_4_;
  auVar179._0_4_ = fVar70 * auVar18._0_4_;
  fVar93 = auVar15._4_4_;
  auVar179._4_4_ = fVar93 * auVar18._4_4_;
  auVar179._8_4_ = fVar70 * auVar18._8_4_;
  auVar179._12_4_ = fVar93 * auVar18._12_4_;
  auVar179._16_4_ = fVar70 * auVar18._16_4_;
  auVar179._20_4_ = fVar93 * auVar18._20_4_;
  auVar179._24_4_ = fVar70 * auVar18._24_4_;
  auVar179._28_4_ = 0;
  auVar23._4_4_ = auVar21._4_4_ * fVar93;
  auVar23._0_4_ = auVar21._0_4_ * fVar70;
  auVar23._8_4_ = auVar21._8_4_ * fVar70;
  auVar23._12_4_ = auVar21._12_4_ * fVar93;
  auVar23._16_4_ = auVar21._16_4_ * fVar70;
  auVar23._20_4_ = auVar21._20_4_ * fVar93;
  auVar23._24_4_ = auVar21._24_4_ * fVar70;
  auVar23._28_4_ = auVar18._28_4_;
  auVar18._4_4_ = auVar258._4_4_ * fVar93;
  auVar18._0_4_ = auVar258._0_4_ * fVar70;
  auVar18._8_4_ = auVar258._8_4_ * fVar70;
  auVar18._12_4_ = auVar258._12_4_ * fVar93;
  auVar18._16_4_ = auVar258._16_4_ * fVar70;
  auVar18._20_4_ = auVar258._20_4_ * fVar93;
  auVar18._24_4_ = auVar258._24_4_ * fVar70;
  auVar18._28_4_ = fVar93;
  auVar15 = vfmadd231ps_fma(auVar179,auVar283,auVar17);
  auVar4 = vfmadd231ps_fma(auVar23,auVar283,auVar20);
  auVar5 = vfmadd231ps_fma(auVar18,auVar283,auVar14);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar270,auVar87);
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  auVar245._8_4_ = 0x219392ef;
  auVar245._0_8_ = 0x219392ef219392ef;
  auVar245._12_4_ = 0x219392ef;
  auVar245._16_4_ = 0x219392ef;
  auVar245._20_4_ = 0x219392ef;
  auVar245._24_4_ = 0x219392ef;
  auVar245._28_4_ = 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar3),auVar123);
  auVar87 = vcmpps_avx(auVar87,auVar245,1);
  auVar17 = vblendvps_avx(ZEXT1632(auVar3),auVar245,auVar87);
  auVar87 = vandps_avx(ZEXT1632(auVar16),auVar123);
  auVar87 = vcmpps_avx(auVar87,auVar245,1);
  auVar18 = vblendvps_avx(ZEXT1632(auVar16),auVar245,auVar87);
  auVar87 = vandps_avx(ZEXT1632(auVar131),auVar123);
  auVar87 = vcmpps_avx(auVar87,auVar245,1);
  auVar87 = vblendvps_avx(ZEXT1632(auVar131),auVar245,auVar87);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar270,auVar19);
  auVar19 = vrcpps_avx(auVar17);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar270,auVar22);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = 0x3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar208._16_4_ = 0x3f800000;
  auVar208._20_4_ = 0x3f800000;
  auVar208._24_4_ = 0x3f800000;
  auVar208._28_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar17,auVar19,auVar208);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar19,auVar19);
  auVar17 = vrcpps_avx(auVar18);
  auVar16 = vfnmadd213ps_fma(auVar18,auVar17,auVar208);
  auVar18 = vrcpps_avx(auVar87);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar17,auVar17);
  auVar131 = vfnmadd213ps_fma(auVar87,auVar18,auVar208);
  auVar131 = vfmadd132ps_fma(ZEXT1632(auVar131),auVar18,auVar18);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar6));
  auVar19._4_4_ = auVar15._4_4_ * auVar87._4_4_;
  auVar19._0_4_ = auVar15._0_4_ * auVar87._0_4_;
  auVar19._8_4_ = auVar15._8_4_ * auVar87._8_4_;
  auVar19._12_4_ = auVar15._12_4_ * auVar87._12_4_;
  auVar19._16_4_ = auVar87._16_4_ * 0.0;
  auVar19._20_4_ = auVar87._20_4_ * 0.0;
  auVar19._24_4_ = auVar87._24_4_ * 0.0;
  auVar19._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar6));
  auVar20._4_4_ = auVar15._4_4_ * auVar87._4_4_;
  auVar20._0_4_ = auVar15._0_4_ * auVar87._0_4_;
  auVar20._8_4_ = auVar15._8_4_ * auVar87._8_4_;
  auVar20._12_4_ = auVar15._12_4_ * auVar87._12_4_;
  auVar20._16_4_ = auVar87._16_4_ * 0.0;
  auVar20._20_4_ = auVar87._20_4_ * 0.0;
  auVar20._24_4_ = auVar87._24_4_ * 0.0;
  auVar20._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0xe + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar3));
  auVar21._4_4_ = auVar16._4_4_ * auVar87._4_4_;
  auVar21._0_4_ = auVar16._0_4_ * auVar87._0_4_;
  auVar21._8_4_ = auVar16._8_4_ * auVar87._8_4_;
  auVar21._12_4_ = auVar16._12_4_ * auVar87._12_4_;
  auVar21._16_4_ = auVar87._16_4_ * 0.0;
  auVar21._20_4_ = auVar87._20_4_ * 0.0;
  auVar21._24_4_ = auVar87._24_4_ * 0.0;
  auVar21._28_4_ = auVar87._28_4_;
  auVar108._1_3_ = 0;
  auVar108[0] = PVar8;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar3));
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x15 + 6));
  auVar22._4_4_ = auVar16._4_4_ * auVar87._4_4_;
  auVar22._0_4_ = auVar16._0_4_ * auVar87._0_4_;
  auVar22._8_4_ = auVar16._8_4_ * auVar87._8_4_;
  auVar22._12_4_ = auVar16._12_4_ * auVar87._12_4_;
  auVar22._16_4_ = auVar87._16_4_ * 0.0;
  auVar22._20_4_ = auVar87._20_4_ * 0.0;
  auVar22._24_4_ = auVar87._24_4_ * 0.0;
  auVar22._28_4_ = auVar87._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar17);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar4));
  auVar14._4_4_ = auVar87._4_4_ * auVar131._4_4_;
  auVar14._0_4_ = auVar87._0_4_ * auVar131._0_4_;
  auVar14._8_4_ = auVar87._8_4_ * auVar131._8_4_;
  auVar14._12_4_ = auVar87._12_4_ * auVar131._12_4_;
  auVar14._16_4_ = auVar87._16_4_ * 0.0;
  auVar14._20_4_ = auVar87._20_4_ * 0.0;
  auVar14._24_4_ = auVar87._24_4_ * 0.0;
  auVar14._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar4));
  auVar258._4_4_ = auVar131._4_4_ * auVar87._4_4_;
  auVar258._0_4_ = auVar131._0_4_ * auVar87._0_4_;
  auVar258._8_4_ = auVar131._8_4_ * auVar87._8_4_;
  auVar258._12_4_ = auVar131._12_4_ * auVar87._12_4_;
  auVar258._16_4_ = auVar87._16_4_ * 0.0;
  auVar258._20_4_ = auVar87._20_4_ * 0.0;
  auVar258._24_4_ = auVar87._24_4_ * 0.0;
  auVar258._28_4_ = auVar87._28_4_;
  auVar87 = vpminsd_avx2(auVar19,auVar20);
  auVar17 = vpminsd_avx2(auVar21,auVar22);
  auVar87 = vmaxps_avx(auVar87,auVar17);
  auVar17 = vpminsd_avx2(auVar14,auVar258);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar225._4_4_ = uVar69;
  auVar225._0_4_ = uVar69;
  auVar225._8_4_ = uVar69;
  auVar225._12_4_ = uVar69;
  auVar225._16_4_ = uVar69;
  auVar225._20_4_ = uVar69;
  auVar225._24_4_ = uVar69;
  auVar225._28_4_ = uVar69;
  auVar17 = vmaxps_avx(auVar17,auVar225);
  auVar87 = vmaxps_avx(auVar87,auVar17);
  local_320._4_4_ = auVar87._4_4_ * 0.99999964;
  local_320._0_4_ = auVar87._0_4_ * 0.99999964;
  local_320._8_4_ = auVar87._8_4_ * 0.99999964;
  local_320._12_4_ = auVar87._12_4_ * 0.99999964;
  local_320._16_4_ = auVar87._16_4_ * 0.99999964;
  local_320._20_4_ = auVar87._20_4_ * 0.99999964;
  local_320._24_4_ = auVar87._24_4_ * 0.99999964;
  local_320._28_4_ = 0x3f7ffffa;
  auVar87 = vpmaxsd_avx2(auVar19,auVar20);
  auVar17 = vpmaxsd_avx2(auVar21,auVar22);
  auVar87 = vminps_avx(auVar87,auVar17);
  auVar17 = vpmaxsd_avx2(auVar14,auVar258);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar69;
  auVar124._0_4_ = uVar69;
  auVar124._8_4_ = uVar69;
  auVar124._12_4_ = uVar69;
  auVar124._16_4_ = uVar69;
  auVar124._20_4_ = uVar69;
  auVar124._24_4_ = uVar69;
  auVar124._28_4_ = uVar69;
  auVar17 = vminps_avx(auVar17,auVar124);
  auVar87 = vminps_avx(auVar87,auVar17);
  auVar17._4_4_ = auVar87._4_4_ * 1.0000004;
  auVar17._0_4_ = auVar87._0_4_ * 1.0000004;
  auVar17._8_4_ = auVar87._8_4_ * 1.0000004;
  auVar17._12_4_ = auVar87._12_4_ * 1.0000004;
  auVar17._16_4_ = auVar87._16_4_ * 1.0000004;
  auVar17._20_4_ = auVar87._20_4_ * 1.0000004;
  auVar17._24_4_ = auVar87._24_4_ * 1.0000004;
  auVar17._28_4_ = auVar87._28_4_;
  auVar108[4] = PVar8;
  auVar108._5_3_ = 0;
  auVar108[8] = PVar8;
  auVar108._9_3_ = 0;
  auVar108[0xc] = PVar8;
  auVar108._13_3_ = 0;
  auVar108[0x10] = PVar8;
  auVar108._17_3_ = 0;
  auVar108[0x14] = PVar8;
  auVar108._21_3_ = 0;
  auVar108[0x18] = PVar8;
  auVar108._25_3_ = 0;
  auVar108[0x1c] = PVar8;
  auVar108._29_3_ = 0;
  auVar87 = vcmpps_avx(local_320,auVar17,2);
  auVar17 = vpcmpgtd_avx2(auVar108,_DAT_01fb4ba0);
  auVar87 = vandps_avx(auVar87,auVar17);
  uVar69 = vmovmskps_avx(auVar87);
  uVar66 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar69);
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  iVar58 = 1 << ((uint)k & 0x1f);
  auVar88._4_4_ = iVar58;
  auVar88._0_4_ = iVar58;
  auVar88._8_4_ = iVar58;
  auVar88._12_4_ = iVar58;
  auVar88._16_4_ = iVar58;
  auVar88._20_4_ = iVar58;
  auVar88._24_4_ = iVar58;
  auVar88._28_4_ = iVar58;
  auVar17 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar87 = vpand_avx2(auVar88,auVar17);
  local_380 = vpcmpeqd_avx2(auVar87,auVar17);
LAB_0130b190:
  if (uVar66 == 0) {
    return;
  }
  lVar63 = 0;
  for (uVar68 = uVar66; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar63 = lVar63 + 1;
  }
  uVar61 = *(uint *)(prim + 2);
  uVar9 = *(uint *)(prim + lVar63 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar61].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar9);
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var13 + uVar68 * (long)pvVar12);
  auVar15 = *(undefined1 (*) [16])(_Var13 + (uVar68 + 1) * (long)pvVar12);
  auVar16 = *(undefined1 (*) [16])(_Var13 + (uVar68 + 2) * (long)pvVar12);
  pfVar1 = (float *)(_Var13 + (long)pvVar12 * (uVar68 + 3));
  fVar70 = *pfVar1;
  fVar93 = pfVar1[1];
  fVar113 = pfVar1[2];
  fVar125 = pfVar1[3];
  lVar63 = *(long *)&pGVar10[1].time_range.upper;
  auVar131 = *(undefined1 (*) [16])(lVar63 + (long)p_Var11 * uVar68);
  auVar3 = *(undefined1 (*) [16])(lVar63 + (long)p_Var11 * (uVar68 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar63 + (long)p_Var11 * (uVar68 + 2));
  uVar66 = uVar66 - 1 & uVar66;
  pfVar1 = (float *)(lVar63 + (long)p_Var11 * (uVar68 + 3));
  fVar161 = *pfVar1;
  fVar181 = pfVar1[1];
  fVar182 = pfVar1[2];
  fVar183 = pfVar1[3];
  if (uVar66 != 0) {
    uVar67 = uVar66 - 1 & uVar66;
    for (uVar68 = uVar66; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar67 != 0) {
      for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar241._0_4_ = fVar161 * 0.0;
  auVar241._4_4_ = fVar181 * 0.0;
  auVar241._8_4_ = fVar182 * 0.0;
  auVar241._12_4_ = fVar183 * 0.0;
  auVar272._8_4_ = 0x3e2aaaab;
  auVar272._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar272._12_4_ = 0x3e2aaaab;
  auVar214 = vfmadd213ps_fma(auVar272,auVar4,auVar241);
  auVar199._8_4_ = 0x3f2aaaab;
  auVar199._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar199._12_4_ = 0x3f2aaaab;
  auVar214 = vfmadd231ps_fma(auVar214,auVar3,auVar199);
  auVar7 = vfmadd231ps_fma(auVar214,auVar131,auVar272);
  auVar73._8_4_ = 0x3f000000;
  auVar73._0_8_ = 0x3f0000003f000000;
  auVar73._12_4_ = 0x3f000000;
  auVar214 = vfmadd231ps_fma(auVar241,auVar4,auVar73);
  auVar214 = vfnmadd231ps_fma(auVar214,auVar3,ZEXT816(0) << 0x40);
  auVar250 = vfnmadd231ps_fma(auVar214,auVar131,auVar73);
  auVar247._0_4_ = fVar70 * 0.0;
  auVar247._4_4_ = fVar93 * 0.0;
  auVar247._8_4_ = fVar113 * 0.0;
  auVar247._12_4_ = fVar125 * 0.0;
  auVar153 = ZEXT816(0) << 0x40;
  auVar214 = vfmadd213ps_fma(auVar272,auVar16,auVar247);
  auVar214 = vfmadd231ps_fma(auVar214,auVar15,auVar199);
  auVar214 = vfmadd231ps_fma(auVar214,auVar5,auVar272);
  auVar72 = vfmadd231ps_fma(auVar247,auVar16,auVar73);
  auVar72 = vfnmadd231ps_fma(auVar72,auVar15,auVar153);
  auVar75 = vfnmadd231ps_fma(auVar72,auVar5,auVar73);
  auVar126._0_4_ = fVar161 * 0.16666667;
  auVar126._4_4_ = fVar181 * 0.16666667;
  auVar126._8_4_ = fVar182 * 0.16666667;
  auVar126._12_4_ = fVar183 * 0.16666667;
  auVar72 = vfmadd231ps_fma(auVar126,auVar4,auVar199);
  auVar72 = vfmadd231ps_fma(auVar72,auVar3,auVar272);
  auVar72 = vfmadd231ps_fma(auVar72,auVar131,auVar153);
  auVar140._0_4_ = fVar161 * 0.5;
  auVar140._4_4_ = fVar181 * 0.5;
  auVar140._8_4_ = fVar182 * 0.5;
  auVar140._12_4_ = fVar183 * 0.5;
  auVar4 = vfmadd231ps_fma(auVar140,auVar153,auVar4);
  auVar3 = vfnmadd231ps_fma(auVar4,auVar73,auVar3);
  auVar24 = vfnmadd231ps_fma(auVar3,auVar153,auVar131);
  auVar213._0_4_ = fVar70 * 0.16666667;
  auVar213._4_4_ = fVar93 * 0.16666667;
  auVar213._8_4_ = fVar113 * 0.16666667;
  auVar213._12_4_ = fVar125 * 0.16666667;
  auVar114._8_4_ = 0x3f2aaaab;
  auVar114._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar114._12_4_ = 0x3f2aaaab;
  auVar131 = vfmadd231ps_fma(auVar213,auVar16,auVar114);
  auVar131 = vfmadd231ps_fma(auVar131,auVar15,auVar272);
  auVar4 = vfmadd231ps_fma(auVar131,auVar5,auVar153);
  auVar230._0_4_ = fVar70 * 0.5;
  auVar230._4_4_ = fVar93 * 0.5;
  auVar230._8_4_ = fVar113 * 0.5;
  auVar230._12_4_ = fVar125 * 0.5;
  auVar16 = vfmadd231ps_fma(auVar230,auVar153,auVar16);
  auVar15 = vfnmadd231ps_fma(auVar16,auVar73,auVar15);
  auVar5 = vfnmadd231ps_fma(auVar15,auVar153,auVar5);
  auVar15 = vshufps_avx(auVar250,auVar250,0xc9);
  auVar16 = vshufps_avx(auVar214,auVar214,0xc9);
  fVar94 = auVar250._0_4_;
  auVar163._0_4_ = fVar94 * auVar16._0_4_;
  fVar95 = auVar250._4_4_;
  auVar163._4_4_ = fVar95 * auVar16._4_4_;
  fVar71 = auVar250._8_4_;
  auVar163._8_4_ = fVar71 * auVar16._8_4_;
  fVar162 = auVar250._12_4_;
  auVar163._12_4_ = fVar162 * auVar16._12_4_;
  auVar16 = vfmsub231ps_fma(auVar163,auVar15,auVar214);
  auVar131 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar16 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar164._0_4_ = fVar94 * auVar16._0_4_;
  auVar164._4_4_ = fVar95 * auVar16._4_4_;
  auVar164._8_4_ = fVar71 * auVar16._8_4_;
  auVar164._12_4_ = fVar162 * auVar16._12_4_;
  auVar15 = vfmsub231ps_fma(auVar164,auVar15,auVar75);
  auVar3 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar16 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar229 = auVar24._0_4_;
  auVar148._0_4_ = fVar229 * auVar16._0_4_;
  fVar138 = auVar24._4_4_;
  auVar148._4_4_ = fVar138 * auVar16._4_4_;
  fVar139 = auVar24._8_4_;
  auVar148._8_4_ = fVar139 * auVar16._8_4_;
  fVar147 = auVar24._12_4_;
  auVar148._12_4_ = fVar147 * auVar16._12_4_;
  auVar16 = vfmsub231ps_fma(auVar148,auVar15,auVar4);
  auVar4 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar16 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar184._0_4_ = fVar229 * auVar16._0_4_;
  auVar184._4_4_ = fVar138 * auVar16._4_4_;
  auVar184._8_4_ = fVar139 * auVar16._8_4_;
  auVar184._12_4_ = fVar147 * auVar16._12_4_;
  auVar16 = vfmsub231ps_fma(auVar184,auVar15,auVar5);
  auVar15 = vdpps_avx(auVar131,auVar131,0x7f);
  auVar5 = vshufps_avx(auVar16,auVar16,0xc9);
  fVar93 = auVar15._0_4_;
  auVar214 = ZEXT416((uint)fVar93);
  auVar16 = vrsqrtss_avx(auVar214,auVar214);
  fVar70 = auVar16._0_4_;
  auVar16 = vdpps_avx(auVar131,auVar3,0x7f);
  fVar70 = fVar70 * 1.5 + fVar93 * -0.5 * fVar70 * fVar70 * fVar70;
  fVar161 = auVar131._0_4_ * fVar70;
  fVar181 = auVar131._4_4_ * fVar70;
  fVar182 = auVar131._8_4_ * fVar70;
  fVar183 = auVar131._12_4_ * fVar70;
  auVar240._0_4_ = auVar3._0_4_ * fVar93;
  auVar240._4_4_ = auVar3._4_4_ * fVar93;
  auVar240._8_4_ = auVar3._8_4_ * fVar93;
  auVar240._12_4_ = auVar3._12_4_ * fVar93;
  fVar93 = auVar16._0_4_;
  auVar200._0_4_ = auVar131._0_4_ * fVar93;
  auVar200._4_4_ = auVar131._4_4_ * fVar93;
  auVar200._8_4_ = auVar131._8_4_ * fVar93;
  auVar200._12_4_ = auVar131._12_4_ * fVar93;
  auVar131 = vsubps_avx(auVar240,auVar200);
  auVar16 = vrcpss_avx(auVar214,auVar214);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar113 = auVar16._0_4_ * auVar15._0_4_;
  auVar15 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar125 = auVar15._0_4_;
  auVar214 = ZEXT416((uint)fVar125);
  auVar16 = vrsqrtss_avx(auVar214,auVar214);
  fVar93 = auVar16._0_4_;
  fVar93 = fVar93 * 1.5 + fVar125 * -0.5 * fVar93 * fVar93 * fVar93;
  fVar246 = fVar93 * auVar4._0_4_;
  fVar259 = fVar93 * auVar4._4_4_;
  fVar260 = fVar93 * auVar4._8_4_;
  fVar261 = fVar93 * auVar4._12_4_;
  auVar16 = vdpps_avx(auVar4,auVar5,0x7f);
  auVar185._0_4_ = fVar125 * auVar5._0_4_;
  auVar185._4_4_ = fVar125 * auVar5._4_4_;
  auVar185._8_4_ = fVar125 * auVar5._8_4_;
  auVar185._12_4_ = fVar125 * auVar5._12_4_;
  fVar125 = auVar16._0_4_;
  auVar149._0_4_ = fVar125 * auVar4._0_4_;
  auVar149._4_4_ = fVar125 * auVar4._4_4_;
  auVar149._8_4_ = fVar125 * auVar4._8_4_;
  auVar149._12_4_ = fVar125 * auVar4._12_4_;
  auVar3 = vsubps_avx(auVar185,auVar149);
  auVar16 = vrcpss_avx(auVar214,auVar214);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar125 = auVar15._0_4_ * auVar16._0_4_;
  auVar15 = vshufps_avx(auVar7,auVar7,0xff);
  auVar215._0_4_ = auVar15._0_4_ * fVar161;
  auVar215._4_4_ = auVar15._4_4_ * fVar181;
  auVar215._8_4_ = auVar15._8_4_ * fVar182;
  auVar215._12_4_ = auVar15._12_4_ * fVar183;
  local_550 = vsubps_avx(auVar7,auVar215);
  auVar16 = vshufps_avx(auVar250,auVar250,0xff);
  auVar165._0_4_ = auVar16._0_4_ * fVar161 + fVar70 * auVar131._0_4_ * fVar113 * auVar15._0_4_;
  auVar165._4_4_ = auVar16._4_4_ * fVar181 + fVar70 * auVar131._4_4_ * fVar113 * auVar15._4_4_;
  auVar165._8_4_ = auVar16._8_4_ * fVar182 + fVar70 * auVar131._8_4_ * fVar113 * auVar15._8_4_;
  auVar165._12_4_ = auVar16._12_4_ * fVar183 + fVar70 * auVar131._12_4_ * fVar113 * auVar15._12_4_;
  auVar131 = vsubps_avx(auVar250,auVar165);
  local_560._0_4_ = auVar7._0_4_ + auVar215._0_4_;
  local_560._4_4_ = auVar7._4_4_ + auVar215._4_4_;
  fStack_558 = auVar7._8_4_ + auVar215._8_4_;
  fStack_554 = auVar7._12_4_ + auVar215._12_4_;
  auVar15 = vshufps_avx(auVar72,auVar72,0xff);
  auVar115._0_4_ = fVar246 * auVar15._0_4_;
  auVar115._4_4_ = fVar259 * auVar15._4_4_;
  auVar115._8_4_ = fVar260 * auVar15._8_4_;
  auVar115._12_4_ = fVar261 * auVar15._12_4_;
  local_570 = vsubps_avx(auVar72,auVar115);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar97._0_4_ = fVar246 * auVar16._0_4_ + auVar15._0_4_ * fVar93 * auVar3._0_4_ * fVar125;
  auVar97._4_4_ = fVar259 * auVar16._4_4_ + auVar15._4_4_ * fVar93 * auVar3._4_4_ * fVar125;
  auVar97._8_4_ = fVar260 * auVar16._8_4_ + auVar15._8_4_ * fVar93 * auVar3._8_4_ * fVar125;
  auVar97._12_4_ = fVar261 * auVar16._12_4_ + auVar15._12_4_ * fVar93 * auVar3._12_4_ * fVar125;
  auVar15 = vsubps_avx(auVar24,auVar97);
  fVar161 = auVar72._0_4_ + auVar115._0_4_;
  fVar181 = auVar72._4_4_ + auVar115._4_4_;
  fVar182 = auVar72._8_4_ + auVar115._8_4_;
  fVar183 = auVar72._12_4_ + auVar115._12_4_;
  local_580._0_4_ = local_550._0_4_ + auVar131._0_4_ * 0.33333334;
  local_580._4_4_ = local_550._4_4_ + auVar131._4_4_ * 0.33333334;
  local_580._8_4_ = local_550._8_4_ + auVar131._8_4_ * 0.33333334;
  local_580._12_4_ = local_550._12_4_ + auVar131._12_4_ * 0.33333334;
  auVar98._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar98._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar98._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar98._12_4_ = auVar15._12_4_ * 0.33333334;
  local_590 = vsubps_avx(local_570,auVar98);
  local_530 = vsubps_avx(local_550,auVar6);
  auVar15 = vshufps_avx(local_530,local_530,0x55);
  auVar16 = vshufps_avx(local_530,local_530,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar70 = pre->ray_space[k].vz.field_0.m128[0];
  fVar93 = pre->ray_space[k].vz.field_0.m128[1];
  fVar113 = pre->ray_space[k].vz.field_0.m128[2];
  fVar125 = pre->ray_space[k].vz.field_0.m128[3];
  auVar128._0_4_ = fVar70 * auVar16._0_4_;
  auVar128._4_4_ = fVar93 * auVar16._4_4_;
  auVar128._8_4_ = fVar113 * auVar16._8_4_;
  auVar128._12_4_ = fVar125 * auVar16._12_4_;
  auVar131 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar2,auVar15);
  local_540 = vsubps_avx(local_580,auVar6);
  auVar15 = vshufps_avx(local_540,local_540,0x55);
  auVar16 = vshufps_avx(local_540,local_540,0xaa);
  auVar278._0_4_ = fVar70 * auVar16._0_4_;
  auVar278._4_4_ = fVar93 * auVar16._4_4_;
  auVar278._8_4_ = fVar113 * auVar16._8_4_;
  auVar278._12_4_ = fVar125 * auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar2,auVar15);
  local_410 = vsubps_avx(local_590,auVar6);
  auVar15 = vshufps_avx(local_410,local_410,0xaa);
  auVar248._0_4_ = fVar70 * auVar15._0_4_;
  auVar248._4_4_ = fVar93 * auVar15._4_4_;
  auVar248._8_4_ = fVar113 * auVar15._8_4_;
  auVar248._12_4_ = fVar125 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_410,local_410,0x55);
  auVar3 = vfmadd231ps_fma(auVar248,(undefined1  [16])aVar2,auVar15);
  local_420 = vsubps_avx(local_570,auVar6);
  auVar15 = vshufps_avx(local_420,local_420,0xaa);
  auVar262._0_4_ = fVar70 * auVar15._0_4_;
  auVar262._4_4_ = fVar93 * auVar15._4_4_;
  auVar262._8_4_ = fVar113 * auVar15._8_4_;
  auVar262._12_4_ = fVar125 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_420,local_420,0x55);
  auVar4 = vfmadd231ps_fma(auVar262,(undefined1  [16])aVar2,auVar15);
  local_430 = vsubps_avx(_local_560,auVar6);
  auVar15 = vshufps_avx(local_430,local_430,0xaa);
  auVar150._0_4_ = fVar70 * auVar15._0_4_;
  auVar150._4_4_ = fVar93 * auVar15._4_4_;
  auVar150._8_4_ = fVar113 * auVar15._8_4_;
  auVar150._12_4_ = fVar125 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_430,local_430,0x55);
  auVar5 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar2,auVar15);
  local_5a0._0_4_ = (fVar94 + auVar165._0_4_) * 0.33333334 + (float)local_560._0_4_;
  local_5a0._4_4_ = (fVar95 + auVar165._4_4_) * 0.33333334 + (float)local_560._4_4_;
  fStack_598 = (fVar71 + auVar165._8_4_) * 0.33333334 + fStack_558;
  fStack_594 = (fVar162 + auVar165._12_4_) * 0.33333334 + fStack_554;
  local_440 = vsubps_avx(_local_5a0,auVar6);
  auVar15 = vshufps_avx(local_440,local_440,0xaa);
  auVar201._0_4_ = auVar15._0_4_ * fVar70;
  auVar201._4_4_ = auVar15._4_4_ * fVar93;
  auVar201._8_4_ = auVar15._8_4_ * fVar113;
  auVar201._12_4_ = auVar15._12_4_ * fVar125;
  auVar15 = vshufps_avx(local_440,local_440,0x55);
  auVar214 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar15);
  auVar216._0_4_ = (fVar229 + auVar97._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar138 + auVar97._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar139 + auVar97._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar147 + auVar97._12_4_) * 0.33333334;
  auVar24._4_4_ = fVar181;
  auVar24._0_4_ = fVar161;
  auVar24._8_4_ = fVar182;
  auVar24._12_4_ = fVar183;
  _local_5b0 = vsubps_avx(auVar24,auVar216);
  local_450 = vsubps_avx(_local_5b0,auVar6);
  auVar15 = vshufps_avx(local_450,local_450,0xaa);
  auVar217._0_4_ = auVar15._0_4_ * fVar70;
  auVar217._4_4_ = auVar15._4_4_ * fVar93;
  auVar217._8_4_ = auVar15._8_4_ * fVar113;
  auVar217._12_4_ = auVar15._12_4_ * fVar125;
  auVar15 = vshufps_avx(local_450,local_450,0x55);
  auVar7 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar15);
  local_460 = vsubps_avx(auVar24,auVar6);
  auVar15 = vshufps_avx(local_460,local_460,0xaa);
  auVar74._0_4_ = fVar70 * auVar15._0_4_;
  auVar74._4_4_ = fVar93 * auVar15._4_4_;
  auVar74._8_4_ = fVar113 * auVar15._8_4_;
  auVar74._12_4_ = fVar125 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_460,local_460,0x55);
  auVar15 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar15);
  auVar166._4_4_ = local_530._0_4_;
  auVar166._0_4_ = local_530._0_4_;
  auVar166._8_4_ = local_530._0_4_;
  auVar166._12_4_ = local_530._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar6 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar2,auVar166);
  auVar167._4_4_ = local_540._0_4_;
  auVar167._0_4_ = local_540._0_4_;
  auVar167._8_4_ = local_540._0_4_;
  auVar167._12_4_ = local_540._0_4_;
  auVar72 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar2,auVar167);
  uVar69 = local_410._0_4_;
  auVar168._4_4_ = uVar69;
  auVar168._0_4_ = uVar69;
  auVar168._8_4_ = uVar69;
  auVar168._12_4_ = uVar69;
  auVar250 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar168);
  uVar69 = local_420._0_4_;
  auVar169._4_4_ = uVar69;
  auVar169._0_4_ = uVar69;
  auVar169._8_4_ = uVar69;
  auVar169._12_4_ = uVar69;
  auVar75 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar169);
  uVar69 = local_430._0_4_;
  auVar170._4_4_ = uVar69;
  auVar170._0_4_ = uVar69;
  auVar170._8_4_ = uVar69;
  auVar170._12_4_ = uVar69;
  auVar24 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar170);
  uVar69 = local_440._0_4_;
  auVar171._4_4_ = uVar69;
  auVar171._0_4_ = uVar69;
  auVar171._8_4_ = uVar69;
  auVar171._12_4_ = uVar69;
  auVar214 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar171);
  uVar69 = local_450._0_4_;
  auVar172._4_4_ = uVar69;
  auVar172._0_4_ = uVar69;
  auVar172._8_4_ = uVar69;
  auVar172._12_4_ = uVar69;
  auVar7 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar2,auVar172);
  uVar69 = local_460._0_4_;
  auVar173._4_4_ = uVar69;
  auVar173._0_4_ = uVar69;
  auVar173._8_4_ = uVar69;
  auVar173._12_4_ = uVar69;
  auVar73 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar173);
  auVar3 = vmovlhps_avx(auVar6,auVar24);
  auVar4 = vmovlhps_avx(auVar72,auVar214);
  auVar5 = vmovlhps_avx(auVar250,auVar7);
  _local_3e0 = vmovlhps_avx(auVar75,auVar73);
  auVar15 = vminps_avx(auVar3,auVar4);
  auVar16 = vminps_avx(auVar5,_local_3e0);
  auVar131 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar3,auVar4);
  auVar16 = vmaxps_avx(auVar5,_local_3e0);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vshufpd_avx(auVar131,auVar131,3);
  auVar131 = vminps_avx(auVar131,auVar16);
  auVar16 = vshufpd_avx(auVar15,auVar15,3);
  auVar16 = vmaxps_avx(auVar15,auVar16);
  local_3f0._8_4_ = 0x7fffffff;
  local_3f0._0_8_ = 0x7fffffff7fffffff;
  local_3f0._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(local_3f0,auVar131);
  auVar16 = vandps_avx(local_3f0,auVar16);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar16,auVar15);
  local_1c0 = auVar15._0_4_ * 9.536743e-07;
  auVar186._8_8_ = auVar6._0_8_;
  auVar186._0_8_ = auVar6._0_8_;
  auVar231._8_8_ = auVar72._0_8_;
  auVar231._0_8_ = auVar72._0_8_;
  auVar249._0_8_ = auVar250._0_8_;
  auVar249._8_8_ = auVar249._0_8_;
  auVar263._0_8_ = auVar75._0_8_;
  auVar263._8_8_ = auVar263._0_8_;
  local_400 = ZEXT416((uint)local_1c0);
  local_520 = 0x80000000;
  uStack_51c = 0x80000000;
  uStack_518 = 0x80000000;
  uStack_514 = 0x80000000;
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_340 = uVar61;
  uStack_33c = uVar61;
  uStack_338 = uVar61;
  uStack_334 = uVar61;
  uStack_330 = uVar61;
  uStack_32c = uVar61;
  uStack_328 = uVar61;
  uStack_324 = uVar61;
  local_360 = uVar9;
  uStack_35c = uVar9;
  uStack_358 = uVar9;
  uStack_354 = uVar9;
  uStack_350 = uVar9;
  uStack_34c = uVar9;
  uStack_348 = uVar9;
  uStack_344 = uVar9;
  uVar68 = 0;
  fVar70 = *(float *)(ray + k * 4 + 0x60);
  local_3b0 = vsubps_avx(auVar4,auVar3);
  local_3c0 = vsubps_avx(auVar5,auVar4);
  local_3d0 = vsubps_avx(_local_3e0,auVar5);
  local_480 = vsubps_avx(_local_560,local_550);
  local_490 = vsubps_avx(_local_5a0,local_580);
  local_4a0 = vsubps_avx(_local_5b0,local_590);
  auVar153._4_4_ = fVar181;
  auVar153._0_4_ = fVar161;
  auVar153._8_4_ = fVar182;
  auVar153._12_4_ = fVar183;
  _local_4b0 = vsubps_avx(auVar153,local_570);
  auVar75 = ZEXT816(0x3f80000000000000);
  local_470 = auVar75;
LAB_0130b9a9:
  auVar15 = vshufps_avx(auVar75,auVar75,0x50);
  auVar279._8_4_ = 0x3f800000;
  auVar279._0_8_ = 0x3f8000003f800000;
  auVar279._12_4_ = 0x3f800000;
  auVar284._16_4_ = 0x3f800000;
  auVar284._0_16_ = auVar279;
  auVar284._20_4_ = 0x3f800000;
  auVar284._24_4_ = 0x3f800000;
  auVar284._28_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar279,auVar15);
  fVar93 = auVar15._0_4_;
  fVar139 = auVar24._0_4_;
  auVar76._0_4_ = fVar139 * fVar93;
  fVar113 = auVar15._4_4_;
  fVar147 = auVar24._4_4_;
  auVar76._4_4_ = fVar147 * fVar113;
  fVar125 = auVar15._8_4_;
  auVar76._8_4_ = fVar139 * fVar125;
  fVar94 = auVar15._12_4_;
  auVar76._12_4_ = fVar147 * fVar94;
  fVar246 = auVar214._0_4_;
  auVar174._0_4_ = fVar246 * fVar93;
  fVar259 = auVar214._4_4_;
  auVar174._4_4_ = fVar259 * fVar113;
  auVar174._8_4_ = fVar246 * fVar125;
  auVar174._12_4_ = fVar259 * fVar94;
  fVar198 = auVar7._0_4_;
  auVar141._0_4_ = fVar198 * fVar93;
  fVar211 = auVar7._4_4_;
  auVar141._4_4_ = fVar211 * fVar113;
  auVar141._8_4_ = fVar198 * fVar125;
  auVar141._12_4_ = fVar211 * fVar94;
  fVar212 = auVar73._0_4_;
  auVar116._0_4_ = fVar212 * fVar93;
  fVar228 = auVar73._4_4_;
  auVar116._4_4_ = fVar228 * fVar113;
  auVar116._8_4_ = fVar212 * fVar125;
  auVar116._12_4_ = fVar228 * fVar94;
  auVar72 = vfmadd231ps_fma(auVar76,auVar16,auVar186);
  auVar250 = vfmadd231ps_fma(auVar174,auVar16,auVar231);
  auVar153 = vfmadd231ps_fma(auVar141,auVar16,auVar249);
  auVar74 = vfmadd231ps_fma(auVar116,auVar263,auVar16);
  auVar15 = vmovshdup_avx(local_470);
  fVar93 = local_470._0_4_;
  fStack_288 = (auVar15._0_4_ - fVar93) * 0.04761905;
  auVar226._4_4_ = fVar93;
  auVar226._0_4_ = fVar93;
  auVar226._8_4_ = fVar93;
  auVar226._12_4_ = fVar93;
  auVar226._16_4_ = fVar93;
  auVar226._20_4_ = fVar93;
  auVar226._24_4_ = fVar93;
  auVar226._28_4_ = fVar93;
  auVar109._0_8_ = auVar15._0_8_;
  auVar109._8_8_ = auVar109._0_8_;
  auVar109._16_8_ = auVar109._0_8_;
  auVar109._24_8_ = auVar109._0_8_;
  auVar87 = vsubps_avx(auVar109,auVar226);
  uVar69 = auVar72._0_4_;
  auVar276._4_4_ = uVar69;
  auVar276._0_4_ = uVar69;
  auVar276._8_4_ = uVar69;
  auVar276._12_4_ = uVar69;
  auVar276._16_4_ = uVar69;
  auVar276._20_4_ = uVar69;
  auVar276._24_4_ = uVar69;
  auVar276._28_4_ = uVar69;
  auVar15 = vmovshdup_avx(auVar72);
  uVar96 = auVar15._0_8_;
  auVar271._8_8_ = uVar96;
  auVar271._0_8_ = uVar96;
  auVar271._16_8_ = uVar96;
  auVar271._24_8_ = uVar96;
  fVar138 = auVar250._0_4_;
  auVar256._4_4_ = fVar138;
  auVar256._0_4_ = fVar138;
  auVar256._8_4_ = fVar138;
  auVar256._12_4_ = fVar138;
  auVar256._16_4_ = fVar138;
  auVar256._20_4_ = fVar138;
  auVar256._24_4_ = fVar138;
  auVar256._28_4_ = fVar138;
  auVar16 = vmovshdup_avx(auVar250);
  auVar110._0_8_ = auVar16._0_8_;
  auVar110._8_8_ = auVar110._0_8_;
  auVar110._16_8_ = auVar110._0_8_;
  auVar110._24_8_ = auVar110._0_8_;
  fVar229 = auVar153._0_4_;
  auVar190._4_4_ = fVar229;
  auVar190._0_4_ = fVar229;
  auVar190._8_4_ = fVar229;
  auVar190._12_4_ = fVar229;
  auVar190._16_4_ = fVar229;
  auVar190._20_4_ = fVar229;
  auVar190._24_4_ = fVar229;
  auVar190._28_4_ = fVar229;
  auVar131 = vmovshdup_avx(auVar153);
  auVar209._0_8_ = auVar131._0_8_;
  auVar209._8_8_ = auVar209._0_8_;
  auVar209._16_8_ = auVar209._0_8_;
  auVar209._24_8_ = auVar209._0_8_;
  fVar162 = auVar74._0_4_;
  auVar6 = vmovshdup_avx(auVar74);
  auVar241 = vfmadd132ps_fma(auVar87,auVar226,_DAT_01f7b040);
  auVar87 = vsubps_avx(auVar284,ZEXT1632(auVar241));
  fVar93 = auVar241._0_4_;
  fVar113 = auVar241._4_4_;
  auVar26._4_4_ = fVar138 * fVar113;
  auVar26._0_4_ = fVar138 * fVar93;
  fVar125 = auVar241._8_4_;
  auVar26._8_4_ = fVar138 * fVar125;
  fVar94 = auVar241._12_4_;
  auVar26._12_4_ = fVar138 * fVar94;
  auVar26._16_4_ = fVar138 * 0.0;
  auVar26._20_4_ = fVar138 * 0.0;
  auVar26._24_4_ = fVar138 * 0.0;
  auVar26._28_4_ = 0x3f800000;
  auVar241 = vfmadd231ps_fma(auVar26,auVar87,auVar276);
  fVar95 = auVar16._0_4_;
  fVar71 = auVar16._4_4_;
  auVar27._4_4_ = fVar71 * fVar113;
  auVar27._0_4_ = fVar95 * fVar93;
  auVar27._8_4_ = fVar95 * fVar125;
  auVar27._12_4_ = fVar71 * fVar94;
  auVar27._16_4_ = fVar95 * 0.0;
  auVar27._20_4_ = fVar71 * 0.0;
  auVar27._24_4_ = fVar95 * 0.0;
  auVar27._28_4_ = uVar69;
  auVar97 = vfmadd231ps_fma(auVar27,auVar87,auVar271);
  auVar28._4_4_ = fVar229 * fVar113;
  auVar28._0_4_ = fVar229 * fVar93;
  auVar28._8_4_ = fVar229 * fVar125;
  auVar28._12_4_ = fVar229 * fVar94;
  auVar28._16_4_ = fVar229 * 0.0;
  auVar28._20_4_ = fVar229 * 0.0;
  auVar28._24_4_ = fVar229 * 0.0;
  auVar28._28_4_ = auVar15._4_4_;
  auVar98 = vfmadd231ps_fma(auVar28,auVar87,auVar256);
  fVar95 = auVar131._0_4_;
  fVar71 = auVar131._4_4_;
  auVar29._4_4_ = fVar71 * fVar113;
  auVar29._0_4_ = fVar95 * fVar93;
  auVar29._8_4_ = fVar95 * fVar125;
  auVar29._12_4_ = fVar71 * fVar94;
  auVar29._16_4_ = fVar95 * 0.0;
  auVar29._20_4_ = fVar71 * 0.0;
  auVar29._24_4_ = fVar95 * 0.0;
  auVar29._28_4_ = fVar138;
  auVar128 = vfmadd231ps_fma(auVar29,auVar87,auVar110);
  auVar15 = vshufps_avx(auVar72,auVar72,0xaa);
  local_740._8_8_ = auVar15._0_8_;
  local_740._0_8_ = local_740._8_8_;
  local_740._16_8_ = local_740._8_8_;
  local_740._24_8_ = local_740._8_8_;
  auVar16 = vshufps_avx(auVar72,auVar72,0xff);
  uStack_798 = auVar16._0_8_;
  local_7a0 = (undefined1  [8])uStack_798;
  uStack_790 = uStack_798;
  uStack_788 = uStack_798;
  auVar30._4_4_ = fVar162 * fVar113;
  auVar30._0_4_ = fVar162 * fVar93;
  auVar30._8_4_ = fVar162 * fVar125;
  auVar30._12_4_ = fVar162 * fVar94;
  auVar30._16_4_ = fVar162 * 0.0;
  auVar30._20_4_ = fVar162 * 0.0;
  auVar30._24_4_ = fVar162 * 0.0;
  auVar30._28_4_ = fVar162;
  auVar72 = vfmadd231ps_fma(auVar30,auVar87,auVar190);
  auVar16 = vshufps_avx(auVar250,auVar250,0xaa);
  auVar191._0_8_ = auVar16._0_8_;
  auVar191._8_8_ = auVar191._0_8_;
  auVar191._16_8_ = auVar191._0_8_;
  auVar191._24_8_ = auVar191._0_8_;
  auVar131 = vshufps_avx(auVar250,auVar250,0xff);
  local_640._8_8_ = auVar131._0_8_;
  local_640._0_8_ = local_640._8_8_;
  local_640._16_8_ = local_640._8_8_;
  local_640._24_8_ = local_640._8_8_;
  fVar95 = auVar6._0_4_;
  fVar71 = auVar6._4_4_;
  auVar31._4_4_ = fVar71 * fVar113;
  auVar31._0_4_ = fVar95 * fVar93;
  auVar31._8_4_ = fVar95 * fVar125;
  auVar31._12_4_ = fVar71 * fVar94;
  auVar31._16_4_ = fVar95 * 0.0;
  auVar31._20_4_ = fVar71 * 0.0;
  auVar31._24_4_ = fVar95 * 0.0;
  auVar31._28_4_ = auVar15._4_4_;
  auVar114 = vfmadd231ps_fma(auVar31,auVar87,auVar209);
  auVar32._28_4_ = fVar71;
  auVar32._0_28_ =
       ZEXT1628(CONCAT412(auVar98._12_4_ * fVar94,
                          CONCAT48(auVar98._8_4_ * fVar125,
                                   CONCAT44(auVar98._4_4_ * fVar113,auVar98._0_4_ * fVar93))));
  auVar241 = vfmadd231ps_fma(auVar32,auVar87,ZEXT1632(auVar241));
  fVar95 = auVar131._4_4_;
  auVar33._28_4_ = fVar95;
  auVar33._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar94,
                          CONCAT48(auVar128._8_4_ * fVar125,
                                   CONCAT44(auVar128._4_4_ * fVar113,auVar128._0_4_ * fVar93))));
  auVar97 = vfmadd231ps_fma(auVar33,auVar87,ZEXT1632(auVar97));
  auVar15 = vshufps_avx(auVar153,auVar153,0xaa);
  uVar96 = auVar15._0_8_;
  auVar180._8_8_ = uVar96;
  auVar180._0_8_ = uVar96;
  auVar180._16_8_ = uVar96;
  auVar180._24_8_ = uVar96;
  auVar6 = vshufps_avx(auVar153,auVar153,0xff);
  uVar96 = auVar6._0_8_;
  auVar285._8_8_ = uVar96;
  auVar285._0_8_ = uVar96;
  auVar285._16_8_ = uVar96;
  auVar285._24_8_ = uVar96;
  auVar153 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar94,
                                                CONCAT48(auVar72._8_4_ * fVar125,
                                                         CONCAT44(auVar72._4_4_ * fVar113,
                                                                  auVar72._0_4_ * fVar93)))),auVar87
                             ,ZEXT1632(auVar98));
  auVar72 = vshufps_avx(auVar74,auVar74,0xaa);
  auVar250 = vshufps_avx(auVar74,auVar74,0xff);
  auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar94 * auVar114._12_4_,
                                               CONCAT48(fVar125 * auVar114._8_4_,
                                                        CONCAT44(fVar113 * auVar114._4_4_,
                                                                 fVar93 * auVar114._0_4_)))),auVar87
                            ,ZEXT1632(auVar128));
  auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar94 * auVar153._12_4_,
                                               CONCAT48(fVar125 * auVar153._8_4_,
                                                        CONCAT44(fVar113 * auVar153._4_4_,
                                                                 fVar93 * auVar153._0_4_)))),auVar87
                            ,ZEXT1632(auVar241));
  auVar17 = vsubps_avx(ZEXT1632(auVar153),ZEXT1632(auVar241));
  auVar153 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar94 * auVar74._12_4_,
                                                CONCAT48(fVar125 * auVar74._8_4_,
                                                         CONCAT44(fVar113 * auVar74._4_4_,
                                                                  fVar93 * auVar74._0_4_)))),auVar87
                             ,ZEXT1632(auVar97));
  auVar18 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar97));
  fVar71 = auVar18._28_4_;
  auVar257._0_4_ = fStack_288 * auVar17._0_4_ * 3.0;
  auVar257._4_4_ = fStack_288 * auVar17._4_4_ * 3.0;
  auVar257._8_4_ = fStack_288 * auVar17._8_4_ * 3.0;
  auVar257._12_4_ = fStack_288 * auVar17._12_4_ * 3.0;
  auVar257._16_4_ = fStack_288 * auVar17._16_4_ * 3.0;
  auVar257._20_4_ = fStack_288 * auVar17._20_4_ * 3.0;
  auVar257._24_4_ = fStack_288 * auVar17._24_4_ * 3.0;
  auVar257._28_4_ = 0;
  local_5e0._0_4_ = fStack_288 * auVar18._0_4_ * 3.0;
  local_5e0._4_4_ = fStack_288 * auVar18._4_4_ * 3.0;
  fStack_5d8 = fStack_288 * auVar18._8_4_ * 3.0;
  fStack_5d4 = fStack_288 * auVar18._12_4_ * 3.0;
  fStack_5d0 = fStack_288 * auVar18._16_4_ * 3.0;
  fStack_5cc = fStack_288 * auVar18._20_4_ * 3.0;
  fStack_5c8 = fStack_288 * auVar18._24_4_ * 3.0;
  fStack_5c4 = fVar71;
  fVar162 = auVar16._0_4_;
  fVar229 = auVar16._4_4_;
  auVar34._4_4_ = fVar229 * fVar113;
  auVar34._0_4_ = fVar162 * fVar93;
  auVar34._8_4_ = fVar162 * fVar125;
  auVar34._12_4_ = fVar229 * fVar94;
  auVar34._16_4_ = fVar162 * 0.0;
  auVar34._20_4_ = fVar229 * 0.0;
  auVar34._24_4_ = fVar162 * 0.0;
  auVar34._28_4_ = fVar71;
  auVar16 = vfmadd231ps_fma(auVar34,auVar87,local_740);
  fVar162 = auVar131._0_4_;
  auVar35._4_4_ = fVar95 * fVar113;
  auVar35._0_4_ = fVar162 * fVar93;
  auVar35._8_4_ = fVar162 * fVar125;
  auVar35._12_4_ = fVar95 * fVar94;
  auVar35._16_4_ = fVar162 * 0.0;
  auVar35._20_4_ = fVar95 * 0.0;
  auVar35._24_4_ = fVar162 * 0.0;
  auVar35._28_4_ = 0;
  auVar131 = vfmadd231ps_fma(auVar35,auVar87,_local_7a0);
  fVar95 = auVar15._0_4_;
  fVar162 = auVar15._4_4_;
  auVar36._4_4_ = fVar162 * fVar113;
  auVar36._0_4_ = fVar95 * fVar93;
  auVar36._8_4_ = fVar95 * fVar125;
  auVar36._12_4_ = fVar162 * fVar94;
  auVar36._16_4_ = fVar95 * 0.0;
  auVar36._20_4_ = fVar162 * 0.0;
  auVar36._24_4_ = fVar95 * 0.0;
  auVar36._28_4_ = auVar17._28_4_;
  auVar15 = vfmadd231ps_fma(auVar36,auVar87,auVar191);
  fVar95 = auVar6._0_4_;
  fVar138 = auVar6._4_4_;
  auVar37._4_4_ = fVar138 * fVar113;
  auVar37._0_4_ = fVar95 * fVar93;
  auVar37._8_4_ = fVar95 * fVar125;
  auVar37._12_4_ = fVar138 * fVar94;
  auVar37._16_4_ = fVar95 * 0.0;
  auVar37._20_4_ = fVar138 * 0.0;
  auVar37._24_4_ = fVar95 * 0.0;
  auVar37._28_4_ = fVar229;
  auVar6 = vfmadd231ps_fma(auVar37,auVar87,local_640);
  auVar21 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar98));
  fVar95 = auVar72._0_4_;
  fVar162 = auVar72._4_4_;
  auVar38._4_4_ = fVar162 * fVar113;
  auVar38._0_4_ = fVar95 * fVar93;
  auVar38._8_4_ = fVar95 * fVar125;
  auVar38._12_4_ = fVar162 * fVar94;
  auVar38._16_4_ = fVar95 * 0.0;
  auVar38._20_4_ = fVar162 * 0.0;
  auVar38._24_4_ = fVar95 * 0.0;
  auVar38._28_4_ = fVar162;
  auVar72 = vfmadd231ps_fma(auVar38,auVar87,auVar180);
  auVar22 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar153));
  fVar95 = auVar250._0_4_;
  fVar162 = auVar250._4_4_;
  auVar39._4_4_ = fVar162 * fVar113;
  auVar39._0_4_ = fVar95 * fVar93;
  auVar39._8_4_ = fVar95 * fVar125;
  auVar39._12_4_ = fVar162 * fVar94;
  auVar39._16_4_ = fVar95 * 0.0;
  auVar39._20_4_ = fVar162 * 0.0;
  auVar39._24_4_ = fVar95 * 0.0;
  auVar39._28_4_ = fVar162;
  auVar250 = vfmadd231ps_fma(auVar39,auVar87,auVar285);
  auVar40._28_4_ = fVar138;
  auVar40._0_28_ =
       ZEXT1628(CONCAT412(auVar15._12_4_ * fVar94,
                          CONCAT48(auVar15._8_4_ * fVar125,
                                   CONCAT44(auVar15._4_4_ * fVar113,auVar15._0_4_ * fVar93))));
  auVar16 = vfmadd231ps_fma(auVar40,auVar87,ZEXT1632(auVar16));
  auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar94 * auVar6._12_4_,
                                                CONCAT48(fVar125 * auVar6._8_4_,
                                                         CONCAT44(fVar113 * auVar6._4_4_,
                                                                  fVar93 * auVar6._0_4_)))),auVar87,
                             ZEXT1632(auVar131));
  auVar111._0_4_ = auVar98._0_4_ + auVar257._0_4_;
  auVar111._4_4_ = auVar98._4_4_ + auVar257._4_4_;
  auVar111._8_4_ = auVar98._8_4_ + auVar257._8_4_;
  auVar111._12_4_ = auVar98._12_4_ + auVar257._12_4_;
  auVar111._16_4_ = auVar257._16_4_ + 0.0;
  auVar111._20_4_ = auVar257._20_4_ + 0.0;
  auVar111._24_4_ = auVar257._24_4_ + 0.0;
  auVar111._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar72._12_4_ * fVar94,
                                               CONCAT48(auVar72._8_4_ * fVar125,
                                                        CONCAT44(auVar72._4_4_ * fVar113,
                                                                 auVar72._0_4_ * fVar93)))),auVar87,
                            ZEXT1632(auVar15));
  auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar250._12_4_ * fVar94,
                                              CONCAT48(auVar250._8_4_ * fVar125,
                                                       CONCAT44(auVar250._4_4_ * fVar113,
                                                                auVar250._0_4_ * fVar93)))),auVar87,
                           ZEXT1632(auVar6));
  auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar94 * auVar15._12_4_,
                                               CONCAT48(fVar125 * auVar15._8_4_,
                                                        CONCAT44(fVar113 * auVar15._4_4_,
                                                                 fVar93 * auVar15._0_4_)))),auVar87,
                            ZEXT1632(auVar16));
  auVar250 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar94,
                                                CONCAT48(auVar6._8_4_ * fVar125,
                                                         CONCAT44(auVar6._4_4_ * fVar113,
                                                                  auVar6._0_4_ * fVar93)))),
                             ZEXT1632(auVar131),auVar87);
  auVar87 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
  auVar17 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar131));
  auVar277._0_4_ = fStack_288 * auVar87._0_4_ * 3.0;
  auVar277._4_4_ = fStack_288 * auVar87._4_4_ * 3.0;
  auVar277._8_4_ = fStack_288 * auVar87._8_4_ * 3.0;
  auVar277._12_4_ = fStack_288 * auVar87._12_4_ * 3.0;
  auVar277._16_4_ = fStack_288 * auVar87._16_4_ * 3.0;
  auVar277._20_4_ = fStack_288 * auVar87._20_4_ * 3.0;
  auVar277._24_4_ = fStack_288 * auVar87._24_4_ * 3.0;
  auVar277._28_4_ = 0;
  local_2a0 = fStack_288 * auVar17._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar17._4_4_ * 3.0;
  auVar41._4_4_ = fStack_29c;
  auVar41._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar17._8_4_ * 3.0;
  auVar41._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar17._12_4_ * 3.0;
  auVar41._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar17._16_4_ * 3.0;
  auVar41._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar17._20_4_ * 3.0;
  auVar41._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar17._24_4_ * 3.0;
  auVar41._24_4_ = fStack_288;
  auVar41._28_4_ = 0x40400000;
  auVar14 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar72));
  local_500 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar250));
  auVar87 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar98));
  auVar17 = vsubps_avx(ZEXT1632(auVar250),ZEXT1632(auVar153));
  auVar18 = vsubps_avx(auVar14,auVar21);
  fVar260 = auVar87._0_4_ + auVar18._0_4_;
  fVar261 = auVar87._4_4_ + auVar18._4_4_;
  fVar193 = auVar87._8_4_ + auVar18._8_4_;
  fVar194 = auVar87._12_4_ + auVar18._12_4_;
  fVar195 = auVar87._16_4_ + auVar18._16_4_;
  fVar196 = auVar87._20_4_ + auVar18._20_4_;
  fVar197 = auVar87._24_4_ + auVar18._24_4_;
  auVar19 = vsubps_avx(local_500,auVar22);
  auVar89._0_4_ = auVar17._0_4_ + auVar19._0_4_;
  auVar89._4_4_ = auVar17._4_4_ + auVar19._4_4_;
  auVar89._8_4_ = auVar17._8_4_ + auVar19._8_4_;
  auVar89._12_4_ = auVar17._12_4_ + auVar19._12_4_;
  auVar89._16_4_ = auVar17._16_4_ + auVar19._16_4_;
  auVar89._20_4_ = auVar17._20_4_ + auVar19._20_4_;
  auVar89._24_4_ = auVar17._24_4_ + auVar19._24_4_;
  auVar89._28_4_ = auVar17._28_4_ + auVar19._28_4_;
  local_240 = ZEXT1632(auVar153);
  fVar93 = auVar153._0_4_;
  local_2c0 = (float)local_5e0._0_4_ + fVar93;
  fVar113 = auVar153._4_4_;
  fStack_2bc = (float)local_5e0._4_4_ + fVar113;
  fVar125 = auVar153._8_4_;
  fStack_2b8 = fStack_5d8 + fVar125;
  fVar94 = auVar153._12_4_;
  fStack_2b4 = fStack_5d4 + fVar94;
  fStack_2b0 = fStack_5d0 + 0.0;
  fStack_2ac = fStack_5cc + 0.0;
  fStack_2a8 = fStack_5c8 + 0.0;
  local_200 = ZEXT1632(auVar98);
  auVar17 = vsubps_avx(local_200,auVar257);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar17);
  auVar17 = vsubps_avx(local_240,_local_5e0);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar17);
  local_260._0_4_ = auVar72._0_4_ + auVar277._0_4_;
  local_260._4_4_ = auVar72._4_4_ + auVar277._4_4_;
  local_260._8_4_ = auVar72._8_4_ + auVar277._8_4_;
  local_260._12_4_ = auVar72._12_4_ + auVar277._12_4_;
  local_260._16_4_ = auVar277._16_4_ + 0.0;
  local_260._20_4_ = auVar277._20_4_ + 0.0;
  local_260._24_4_ = auVar277._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar258 = ZEXT1632(auVar72);
  auVar17 = vsubps_avx(auVar258,auVar277);
  _local_5e0 = vpermps_avx2(_DAT_01fb7720,auVar17);
  fVar95 = auVar250._0_4_;
  local_2a0 = fVar95 + local_2a0;
  fVar162 = auVar250._4_4_;
  fStack_29c = fVar162 + fStack_29c;
  fVar229 = auVar250._8_4_;
  fStack_298 = fVar229 + fStack_298;
  fVar138 = auVar250._12_4_;
  fStack_294 = fVar138 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar17 = vsubps_avx(ZEXT1632(auVar250),auVar41);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar17);
  auVar42._4_4_ = fVar113 * fVar261;
  auVar42._0_4_ = fVar93 * fVar260;
  auVar42._8_4_ = fVar125 * fVar193;
  auVar42._12_4_ = fVar94 * fVar194;
  auVar42._16_4_ = fVar195 * 0.0;
  auVar42._20_4_ = fVar196 * 0.0;
  auVar42._24_4_ = fVar197 * 0.0;
  auVar42._28_4_ = auVar17._28_4_;
  auVar15 = vfnmadd231ps_fma(auVar42,local_200,auVar89);
  fStack_2a4 = fVar71 + 0.0;
  auVar43._4_4_ = fStack_2bc * fVar261;
  auVar43._0_4_ = local_2c0 * fVar260;
  auVar43._8_4_ = fStack_2b8 * fVar193;
  auVar43._12_4_ = fStack_2b4 * fVar194;
  auVar43._16_4_ = fStack_2b0 * fVar195;
  auVar43._20_4_ = fStack_2ac * fVar196;
  auVar43._24_4_ = fStack_2a8 * fVar197;
  auVar43._28_4_ = 0;
  auVar16 = vfnmadd231ps_fma(auVar43,auVar89,auVar111);
  auVar44._4_4_ = local_2e0._4_4_ * fVar261;
  auVar44._0_4_ = local_2e0._0_4_ * fVar260;
  auVar44._8_4_ = local_2e0._8_4_ * fVar193;
  auVar44._12_4_ = local_2e0._12_4_ * fVar194;
  auVar44._16_4_ = local_2e0._16_4_ * fVar195;
  auVar44._20_4_ = local_2e0._20_4_ * fVar196;
  auVar44._24_4_ = local_2e0._24_4_ * fVar197;
  auVar44._28_4_ = fVar71 + 0.0;
  auVar131 = vfnmadd231ps_fma(auVar44,local_220,auVar89);
  local_7a0._0_4_ = auVar22._0_4_;
  local_7a0._4_4_ = auVar22._4_4_;
  uStack_798._0_4_ = auVar22._8_4_;
  uStack_798._4_4_ = auVar22._12_4_;
  uStack_790._0_4_ = auVar22._16_4_;
  uStack_790._4_4_ = auVar22._20_4_;
  uStack_788._0_4_ = auVar22._24_4_;
  uStack_788._4_4_ = auVar22._28_4_;
  auVar45._4_4_ = (float)local_7a0._4_4_ * fVar261;
  auVar45._0_4_ = (float)local_7a0._0_4_ * fVar260;
  auVar45._8_4_ = (float)uStack_798 * fVar193;
  auVar45._12_4_ = uStack_798._4_4_ * fVar194;
  auVar45._16_4_ = (float)uStack_790 * fVar195;
  auVar45._20_4_ = uStack_790._4_4_ * fVar196;
  auVar45._24_4_ = (float)uStack_788 * fVar197;
  auVar45._28_4_ = uStack_788._4_4_;
  auVar6 = vfnmadd231ps_fma(auVar45,auVar21,auVar89);
  auVar210._0_4_ = fVar95 * fVar260;
  auVar210._4_4_ = fVar162 * fVar261;
  auVar210._8_4_ = fVar229 * fVar193;
  auVar210._12_4_ = fVar138 * fVar194;
  auVar210._16_4_ = fVar195 * 0.0;
  auVar210._20_4_ = fVar196 * 0.0;
  auVar210._24_4_ = fVar197 * 0.0;
  auVar210._28_4_ = 0;
  auVar72 = vfnmadd231ps_fma(auVar210,auVar258,auVar89);
  uStack_284 = 0x40400000;
  auVar46._4_4_ = fStack_29c * fVar261;
  auVar46._0_4_ = local_2a0 * fVar260;
  auVar46._8_4_ = fStack_298 * fVar193;
  auVar46._12_4_ = fStack_294 * fVar194;
  auVar46._16_4_ = fStack_290 * fVar195;
  auVar46._20_4_ = fStack_28c * fVar196;
  auVar46._24_4_ = fStack_288 * fVar197;
  auVar46._28_4_ = auVar21._28_4_;
  auVar153 = vfnmadd231ps_fma(auVar46,local_260,auVar89);
  auVar47._4_4_ = local_280._4_4_ * fVar261;
  auVar47._0_4_ = local_280._0_4_ * fVar260;
  auVar47._8_4_ = local_280._8_4_ * fVar193;
  auVar47._12_4_ = local_280._12_4_ * fVar194;
  auVar47._16_4_ = local_280._16_4_ * fVar195;
  auVar47._20_4_ = local_280._20_4_ * fVar196;
  auVar47._24_4_ = local_280._24_4_ * fVar197;
  auVar47._28_4_ = local_280._28_4_;
  auVar74 = vfnmadd231ps_fma(auVar47,_local_5e0,auVar89);
  auVar48._4_4_ = local_500._4_4_ * fVar261;
  auVar48._0_4_ = local_500._0_4_ * fVar260;
  auVar48._8_4_ = local_500._8_4_ * fVar193;
  auVar48._12_4_ = local_500._12_4_ * fVar194;
  auVar48._16_4_ = local_500._16_4_ * fVar195;
  auVar48._20_4_ = local_500._20_4_ * fVar196;
  auVar48._24_4_ = local_500._24_4_ * fVar197;
  auVar48._28_4_ = auVar87._28_4_ + auVar18._28_4_;
  auVar227 = ZEXT3264(auVar14);
  auVar241 = vfnmadd231ps_fma(auVar48,auVar14,auVar89);
  auVar17 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
  auVar87 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
  auVar18 = vminps_avx(ZEXT1632(auVar131),ZEXT1632(auVar6));
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar6));
  auVar87 = vmaxps_avx(auVar87,auVar17);
  auVar19 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar153));
  auVar17 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar153));
  auVar20 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar241));
  auVar19 = vminps_avx(auVar19,auVar20);
  auVar19 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar241));
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(auVar87,auVar17);
  auVar57._4_4_ = fStack_1bc;
  auVar57._0_4_ = local_1c0;
  auVar57._8_4_ = fStack_1b8;
  auVar57._12_4_ = fStack_1b4;
  auVar57._16_4_ = fStack_1b0;
  auVar57._20_4_ = fStack_1ac;
  auVar57._24_4_ = fStack_1a8;
  auVar57._28_4_ = fStack_1a4;
  auVar87 = vcmpps_avx(auVar19,auVar57,2);
  auVar56._4_4_ = fStack_1dc;
  auVar56._0_4_ = local_1e0;
  auVar56._8_4_ = fStack_1d8;
  auVar56._12_4_ = fStack_1d4;
  auVar56._16_4_ = fStack_1d0;
  auVar56._20_4_ = fStack_1cc;
  auVar56._24_4_ = fStack_1c8;
  auVar56._28_4_ = fStack_1c4;
  auVar17 = vcmpps_avx(auVar17,auVar56,5);
  auVar87 = vandps_avx(auVar17,auVar87);
  auVar17 = local_300 & auVar87;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0') {
    auVar17 = vsubps_avx(auVar21,local_200);
    auVar18 = vsubps_avx(auVar14,auVar258);
    fVar260 = auVar17._0_4_ + auVar18._0_4_;
    fVar261 = auVar17._4_4_ + auVar18._4_4_;
    fVar193 = auVar17._8_4_ + auVar18._8_4_;
    fVar194 = auVar17._12_4_ + auVar18._12_4_;
    fVar195 = auVar17._16_4_ + auVar18._16_4_;
    fVar196 = auVar17._20_4_ + auVar18._20_4_;
    fVar197 = auVar17._24_4_ + auVar18._24_4_;
    auVar19 = vsubps_avx(auVar22,local_240);
    auVar20 = vsubps_avx(local_500,ZEXT1632(auVar250));
    auVar112._0_4_ = auVar19._0_4_ + auVar20._0_4_;
    auVar112._4_4_ = auVar19._4_4_ + auVar20._4_4_;
    auVar112._8_4_ = auVar19._8_4_ + auVar20._8_4_;
    auVar112._12_4_ = auVar19._12_4_ + auVar20._12_4_;
    auVar112._16_4_ = auVar19._16_4_ + auVar20._16_4_;
    auVar112._20_4_ = auVar19._20_4_ + auVar20._20_4_;
    auVar112._24_4_ = auVar19._24_4_ + auVar20._24_4_;
    fVar71 = auVar20._28_4_;
    auVar112._28_4_ = auVar19._28_4_ + fVar71;
    auVar49._4_4_ = fVar113 * fVar261;
    auVar49._0_4_ = fVar93 * fVar260;
    auVar49._8_4_ = fVar125 * fVar193;
    auVar49._12_4_ = fVar94 * fVar194;
    auVar49._16_4_ = fVar195 * 0.0;
    auVar49._20_4_ = fVar196 * 0.0;
    auVar49._24_4_ = fVar197 * 0.0;
    auVar49._28_4_ = local_500._28_4_;
    auVar72 = vfnmadd231ps_fma(auVar49,auVar112,local_200);
    auVar50._4_4_ = fVar261 * fStack_2bc;
    auVar50._0_4_ = fVar260 * local_2c0;
    auVar50._8_4_ = fVar193 * fStack_2b8;
    auVar50._12_4_ = fVar194 * fStack_2b4;
    auVar50._16_4_ = fVar195 * fStack_2b0;
    auVar50._20_4_ = fVar196 * fStack_2ac;
    auVar50._24_4_ = fVar197 * fStack_2a8;
    auVar50._28_4_ = 0;
    auVar15 = vfnmadd213ps_fma(auVar111,auVar112,auVar50);
    auVar51._4_4_ = fVar261 * local_2e0._4_4_;
    auVar51._0_4_ = fVar260 * local_2e0._0_4_;
    auVar51._8_4_ = fVar193 * local_2e0._8_4_;
    auVar51._12_4_ = fVar194 * local_2e0._12_4_;
    auVar51._16_4_ = fVar195 * local_2e0._16_4_;
    auVar51._20_4_ = fVar196 * local_2e0._20_4_;
    auVar51._24_4_ = fVar197 * local_2e0._24_4_;
    auVar51._28_4_ = 0;
    auVar16 = vfnmadd213ps_fma(local_220,auVar112,auVar51);
    auVar52._4_4_ = (float)local_7a0._4_4_ * fVar261;
    auVar52._0_4_ = (float)local_7a0._0_4_ * fVar260;
    auVar52._8_4_ = (float)uStack_798 * fVar193;
    auVar52._12_4_ = uStack_798._4_4_ * fVar194;
    auVar52._16_4_ = (float)uStack_790 * fVar195;
    auVar52._20_4_ = uStack_790._4_4_ * fVar196;
    auVar52._24_4_ = (float)uStack_788 * fVar197;
    auVar52._28_4_ = 0;
    auVar250 = vfnmadd231ps_fma(auVar52,auVar112,auVar21);
    auVar136._0_4_ = fVar95 * fVar260;
    auVar136._4_4_ = fVar162 * fVar261;
    auVar136._8_4_ = fVar229 * fVar193;
    auVar136._12_4_ = fVar138 * fVar194;
    auVar136._16_4_ = fVar195 * 0.0;
    auVar136._20_4_ = fVar196 * 0.0;
    auVar136._24_4_ = fVar197 * 0.0;
    auVar136._28_4_ = 0;
    auVar153 = vfnmadd231ps_fma(auVar136,auVar112,auVar258);
    auVar53._4_4_ = fVar261 * fStack_29c;
    auVar53._0_4_ = fVar260 * local_2a0;
    auVar53._8_4_ = fVar193 * fStack_298;
    auVar53._12_4_ = fVar194 * fStack_294;
    auVar53._16_4_ = fVar195 * fStack_290;
    auVar53._20_4_ = fVar196 * fStack_28c;
    auVar53._24_4_ = fVar197 * fStack_288;
    auVar53._28_4_ = fVar71;
    auVar131 = vfnmadd213ps_fma(local_260,auVar112,auVar53);
    auVar54._4_4_ = fVar261 * local_280._4_4_;
    auVar54._0_4_ = fVar260 * local_280._0_4_;
    auVar54._8_4_ = fVar193 * local_280._8_4_;
    auVar54._12_4_ = fVar194 * local_280._12_4_;
    auVar54._16_4_ = fVar195 * local_280._16_4_;
    auVar54._20_4_ = fVar196 * local_280._20_4_;
    auVar54._24_4_ = fVar197 * local_280._24_4_;
    auVar54._28_4_ = fVar71;
    auVar6 = vfnmadd213ps_fma(_local_5e0,auVar112,auVar54);
    auVar227 = ZEXT1664(auVar6);
    auVar55._4_4_ = fVar261 * local_500._4_4_;
    auVar55._0_4_ = fVar260 * local_500._0_4_;
    auVar55._8_4_ = fVar193 * local_500._8_4_;
    auVar55._12_4_ = fVar194 * local_500._12_4_;
    auVar55._16_4_ = fVar195 * local_500._16_4_;
    auVar55._20_4_ = fVar196 * local_500._20_4_;
    auVar55._24_4_ = fVar197 * local_500._24_4_;
    auVar55._28_4_ = auVar17._28_4_ + auVar18._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar55,auVar112,auVar14);
    auVar18 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar15));
    auVar17 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar15));
    auVar19 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar250));
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar250));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar20 = vminps_avx(ZEXT1632(auVar153),ZEXT1632(auVar131));
    auVar18 = vmaxps_avx(ZEXT1632(auVar153),ZEXT1632(auVar131));
    auVar21 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar74));
    auVar20 = vminps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar74));
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vcmpps_avx(auVar20,auVar57,2);
    auVar18 = vcmpps_avx(auVar18,auVar56,5);
    auVar17 = vandps_avx(auVar18,auVar17);
    auVar87 = vandps_avx(auVar87,local_300);
    auVar18 = auVar87 & auVar17;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar87 = vandps_avx(auVar17,auVar87);
      uVar59 = vmovmskps_avx(auVar87);
      if (uVar59 != 0) {
        auStack_510[uVar68] = uVar59 & 0xff;
        uVar96 = vmovlps_avx(local_470);
        *(undefined8 *)(&uStack_3a0 + uVar68 * 2) = uVar96;
        uVar67 = vmovlps_avx(auVar75);
        auStack_1a0[uVar68] = uVar67;
        uVar68 = (ulong)((int)uVar68 + 1);
      }
    }
  }
LAB_0130c1eb:
  if ((int)uVar68 == 0) {
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar92._4_4_ = uVar69;
    auVar92._0_4_ = uVar69;
    auVar92._8_4_ = uVar69;
    auVar92._12_4_ = uVar69;
    auVar92._16_4_ = uVar69;
    auVar92._20_4_ = uVar69;
    auVar92._24_4_ = uVar69;
    auVar92._28_4_ = uVar69;
    auVar87 = vcmpps_avx(local_320,auVar92,2);
    uVar61 = vmovmskps_avx(auVar87);
    uVar66 = (ulong)((uint)uVar66 & uVar61);
    goto LAB_0130b190;
  }
  uVar60 = (int)uVar68 - 1;
  uVar62 = (ulong)uVar60;
  uVar65 = auStack_510[uVar62];
  uVar59 = (&uStack_3a0)[uVar62 * 2];
  fVar93 = afStack_39c[uVar62 * 2];
  iVar58 = 0;
  for (uVar67 = (ulong)uVar65; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    iVar58 = iVar58 + 1;
  }
  uVar65 = uVar65 - 1 & uVar65;
  if (uVar65 == 0) {
    uVar68 = (ulong)uVar60;
  }
  auVar75._8_8_ = 0;
  auVar75._0_8_ = auStack_1a0[uVar62];
  auStack_510[uVar62] = uVar65;
  fVar113 = (float)(iVar58 + 1) * 0.14285715;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * (float)iVar58 * 0.14285715)),ZEXT416(uVar59),
                            ZEXT416((uint)(1.0 - (float)iVar58 * 0.14285715)));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * fVar113)),ZEXT416(uVar59),
                            ZEXT416((uint)(1.0 - fVar113)));
  fVar113 = auVar16._0_4_;
  auVar192._0_4_ = auVar15._0_4_;
  fVar93 = fVar113 - auVar192._0_4_;
  if (fVar93 < 0.16666667) {
    auVar131 = vshufps_avx(auVar75,auVar75,0x50);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar6 = vsubps_avx(auVar99,auVar131);
    fVar125 = auVar131._0_4_;
    auVar142._0_4_ = fVar125 * fVar139;
    fVar94 = auVar131._4_4_;
    auVar142._4_4_ = fVar94 * fVar147;
    fVar95 = auVar131._8_4_;
    auVar142._8_4_ = fVar95 * fVar139;
    fVar71 = auVar131._12_4_;
    auVar142._12_4_ = fVar71 * fVar147;
    auVar151._0_4_ = fVar125 * fVar246;
    auVar151._4_4_ = fVar94 * fVar259;
    auVar151._8_4_ = fVar95 * fVar246;
    auVar151._12_4_ = fVar71 * fVar259;
    auVar175._0_4_ = fVar125 * fVar198;
    auVar175._4_4_ = fVar94 * fVar211;
    auVar175._8_4_ = fVar95 * fVar198;
    auVar175._12_4_ = fVar71 * fVar211;
    auVar77._0_4_ = fVar125 * fVar212;
    auVar77._4_4_ = fVar94 * fVar228;
    auVar77._8_4_ = fVar95 * fVar212;
    auVar77._12_4_ = fVar71 * fVar228;
    auVar131 = vfmadd231ps_fma(auVar142,auVar6,auVar186);
    auVar72 = vfmadd231ps_fma(auVar151,auVar6,auVar231);
    auVar250 = vfmadd231ps_fma(auVar175,auVar6,auVar249);
    auVar6 = vfmadd231ps_fma(auVar77,auVar6,auVar263);
    auVar137._16_16_ = auVar131;
    auVar137._0_16_ = auVar131;
    auVar146._16_16_ = auVar72;
    auVar146._0_16_ = auVar72;
    auVar160._16_16_ = auVar250;
    auVar160._0_16_ = auVar250;
    auVar192._4_4_ = auVar192._0_4_;
    auVar192._8_4_ = auVar192._0_4_;
    auVar192._12_4_ = auVar192._0_4_;
    auVar192._20_4_ = fVar113;
    auVar192._16_4_ = fVar113;
    auVar192._24_4_ = fVar113;
    auVar192._28_4_ = fVar113;
    auVar87 = vsubps_avx(auVar146,auVar137);
    auVar72 = vfmadd213ps_fma(auVar87,auVar192,auVar137);
    auVar87 = vsubps_avx(auVar160,auVar146);
    auVar153 = vfmadd213ps_fma(auVar87,auVar192,auVar146);
    auVar131 = vsubps_avx(auVar6,auVar250);
    auVar91._16_16_ = auVar131;
    auVar91._0_16_ = auVar131;
    auVar131 = vfmadd213ps_fma(auVar91,auVar192,auVar160);
    auVar87 = vsubps_avx(ZEXT1632(auVar153),ZEXT1632(auVar72));
    auVar6 = vfmadd213ps_fma(auVar87,auVar192,ZEXT1632(auVar72));
    auVar87 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar153));
    auVar131 = vfmadd213ps_fma(auVar87,auVar192,ZEXT1632(auVar153));
    auVar87 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar6));
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar87,auVar192);
    fVar229 = auVar87._4_4_ * 3.0;
    fVar125 = fVar93 * 0.33333334;
    local_500._0_8_ =
         CONCAT44(auVar97._4_4_ + fVar125 * fVar229,auVar97._0_4_ + fVar125 * auVar87._0_4_ * 3.0);
    local_500._8_4_ = auVar97._8_4_ + fVar125 * auVar87._8_4_ * 3.0;
    local_500._12_4_ = auVar97._12_4_ + fVar125 * auVar87._12_4_ * 3.0;
    auVar6 = vshufpd_avx(auVar97,auVar97,3);
    auVar72 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar131 = vsubps_avx(auVar6,auVar97);
    auVar250 = vsubps_avx(auVar72,(undefined1  [16])0x0);
    auVar78._0_4_ = auVar131._0_4_ + auVar250._0_4_;
    auVar78._4_4_ = auVar131._4_4_ + auVar250._4_4_;
    auVar78._8_4_ = auVar131._8_4_ + auVar250._8_4_;
    auVar78._12_4_ = auVar131._12_4_ + auVar250._12_4_;
    auVar131 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar250 = vshufps_avx(local_500._0_16_,local_500._0_16_,0xb1);
    auVar273._4_4_ = auVar78._0_4_;
    auVar273._0_4_ = auVar78._0_4_;
    auVar273._8_4_ = auVar78._0_4_;
    auVar273._12_4_ = auVar78._0_4_;
    auVar153 = vshufps_avx(auVar78,auVar78,0x55);
    fVar94 = auVar153._0_4_;
    auVar79._0_4_ = fVar94 * auVar131._0_4_;
    fVar95 = auVar153._4_4_;
    auVar79._4_4_ = fVar95 * auVar131._4_4_;
    fVar71 = auVar153._8_4_;
    auVar79._8_4_ = fVar71 * auVar131._8_4_;
    fVar162 = auVar153._12_4_;
    auVar79._12_4_ = fVar162 * auVar131._12_4_;
    auVar152._0_4_ = fVar94 * auVar250._0_4_;
    auVar152._4_4_ = fVar95 * auVar250._4_4_;
    auVar152._8_4_ = fVar71 * auVar250._8_4_;
    auVar152._12_4_ = fVar162 * auVar250._12_4_;
    auVar74 = vfmadd231ps_fma(auVar79,auVar273,auVar97);
    auVar241 = vfmadd231ps_fma(auVar152,auVar273,local_500._0_16_);
    auVar250 = vshufps_avx(auVar74,auVar74,0xe8);
    auVar153 = vshufps_avx(auVar241,auVar241,0xe8);
    auVar131 = vcmpps_avx(auVar250,auVar153,1);
    uVar59 = vextractps_avx(auVar131,0);
    auVar98 = auVar241;
    if ((uVar59 & 1) == 0) {
      auVar98 = auVar74;
    }
    auVar127._0_4_ = fVar125 * auVar87._16_4_ * 3.0;
    auVar127._4_4_ = fVar125 * fVar229;
    auVar127._8_4_ = fVar125 * auVar87._24_4_ * 3.0;
    auVar127._12_4_ = fVar125 * auVar227._28_4_;
    auVar126 = vsubps_avx((undefined1  [16])0x0,auVar127);
    auVar128 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar114 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar187._0_4_ = fVar94 * auVar128._0_4_;
    auVar187._4_4_ = fVar95 * auVar128._4_4_;
    auVar187._8_4_ = fVar71 * auVar128._8_4_;
    auVar187._12_4_ = fVar162 * auVar128._12_4_;
    auVar202._0_4_ = auVar114._0_4_ * fVar94;
    auVar202._4_4_ = auVar114._4_4_ * fVar95;
    auVar202._8_4_ = auVar114._8_4_ * fVar71;
    auVar202._12_4_ = auVar114._12_4_ * fVar162;
    _local_5e0 = auVar126;
    auVar140 = vfmadd231ps_fma(auVar187,auVar273,auVar126);
    auVar148 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar273);
    auVar114 = vshufps_avx(auVar140,auVar140,0xe8);
    auVar115 = vshufps_avx(auVar148,auVar148,0xe8);
    auVar227 = ZEXT1664(auVar115);
    auVar128 = vcmpps_avx(auVar114,auVar115,1);
    uVar59 = vextractps_avx(auVar128,0);
    auVar149 = auVar148;
    if ((uVar59 & 1) == 0) {
      auVar149 = auVar140;
    }
    auVar98 = vmaxss_avx(auVar149,auVar98);
    auVar250 = vminps_avx(auVar250,auVar153);
    auVar153 = vminps_avx(auVar114,auVar115);
    auVar153 = vminps_avx(auVar250,auVar153);
    auVar131 = vshufps_avx(auVar131,auVar131,0x55);
    auVar131 = vblendps_avx(auVar131,auVar128,2);
    auVar128 = vpslld_avx(auVar131,0x1f);
    auVar131 = vshufpd_avx(auVar241,auVar241,1);
    auVar131 = vinsertps_avx(auVar131,auVar148,0x9c);
    auVar250 = vshufpd_avx(auVar74,auVar74,1);
    auVar250 = vinsertps_avx(auVar250,auVar140,0x9c);
    auVar131 = vblendvps_avx(auVar250,auVar131,auVar128);
    auVar250 = vmovshdup_avx(auVar131);
    auVar131 = vmaxss_avx(auVar250,auVar131);
    fVar71 = auVar153._0_4_;
    auVar250 = vmovshdup_avx(auVar153);
    fVar95 = auVar131._0_4_;
    fVar125 = auVar250._0_4_;
    fVar94 = auVar98._0_4_;
    if (((0.0001 <= fVar71) || (fVar95 <= -0.0001)) && (0.0001 <= fVar125 || fVar95 <= -0.0001))
    goto code_r0x0130c4f9;
    goto LAB_0130c51f;
  }
  local_470 = vinsertps_avx(auVar15,auVar16,0x10);
  goto LAB_0130b9a9;
code_r0x0130c4f9:
  auVar250 = vcmpps_avx(auVar250,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar74 = vcmpps_avx(auVar153,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar250 = vandps_avx(auVar74,auVar250);
  if (fVar94 <= -0.0001 || (auVar250 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0130c1eb;
LAB_0130c51f:
  auVar227 = ZEXT1664(auVar72);
  auVar74 = vcmpps_avx(auVar153,_DAT_01f45a50,1);
  auVar241 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar250 = vcmpss_avx(auVar98,ZEXT816(0) << 0x20,1);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar250 = vblendvps_avx(auVar100,auVar117,auVar250);
  auVar74 = vblendvps_avx(auVar100,auVar117,auVar74);
  fVar229 = auVar74._0_4_;
  fVar162 = auVar250._0_4_;
  auVar250 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar229 == fVar162) && (!NAN(fVar229) && !NAN(fVar162))) {
    auVar250 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar229 == fVar162) && (!NAN(fVar229) && !NAN(fVar162))) {
    auVar241 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar74 = vmovshdup_avx(auVar74);
  fVar138 = auVar74._0_4_;
  auVar74 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar229 != fVar138) || (NAN(fVar229) || NAN(fVar138))) {
    if ((fVar125 != fVar71) || (NAN(fVar125) || NAN(fVar71))) {
      auVar129._0_4_ = (float)((uint)fVar71 ^ local_520);
      auVar129._4_4_ = auVar153._4_4_ ^ uStack_51c;
      auVar129._8_4_ = auVar153._8_4_ ^ uStack_518;
      auVar129._12_4_ = auVar153._12_4_ ^ uStack_514;
      auVar130._0_4_ = auVar129._0_4_ / (fVar125 - fVar71);
      auVar130._4_12_ = auVar129._4_12_;
      auVar153 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
      auVar128 = auVar153;
    }
    else {
      auVar153 = ZEXT816(0) << 0x20;
      if ((fVar71 != 0.0) || (auVar128 = auVar74, NAN(fVar71))) {
        auVar153 = SUB6416(ZEXT464(0x7f800000),0);
        auVar128 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar250 = vminss_avx(auVar250,auVar153);
    auVar241 = vmaxss_avx(auVar128,auVar241);
  }
  auVar131 = vcmpss_avx(auVar131,ZEXT416(0),1);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar118._8_4_ = 0xbf800000;
  auVar118._0_8_ = 0xbf800000bf800000;
  auVar118._12_4_ = 0xbf800000;
  auVar131 = vblendvps_avx(auVar101,auVar118,auVar131);
  fVar125 = auVar131._0_4_;
  if ((fVar162 != fVar125) || (NAN(fVar162) || NAN(fVar125))) {
    if ((fVar95 != fVar94) || (NAN(fVar95) || NAN(fVar94))) {
      auVar80._0_4_ = (float)((uint)fVar94 ^ local_520);
      auVar80._4_4_ = auVar98._4_4_ ^ uStack_51c;
      auVar80._8_4_ = auVar98._8_4_ ^ uStack_518;
      auVar80._12_4_ = auVar98._12_4_ ^ uStack_514;
      auVar132._0_4_ = auVar80._0_4_ / (fVar95 - fVar94);
      auVar132._4_12_ = auVar80._4_12_;
      auVar131 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar132,ZEXT416(0));
      auVar153 = auVar131;
    }
    else if ((fVar94 != 0.0) ||
            (auVar131 = auVar74, auVar153 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar94))) {
      auVar131 = SUB6416(ZEXT464(0xff800000),0);
      auVar153 = SUB6416(ZEXT464(0x7f800000),0);
    }
    auVar250 = vminss_avx(auVar250,auVar153);
    auVar241 = vmaxss_avx(auVar131,auVar241);
  }
  if ((fVar138 != fVar125) || (NAN(fVar138) || NAN(fVar125))) {
    auVar250 = vminss_avx(auVar250,auVar74);
    auVar241 = vmaxss_avx(auVar74,auVar241);
  }
  auVar131 = vmaxss_avx(ZEXT816(0) << 0x40,auVar250);
  auVar250 = vminss_avx(auVar241,auVar74);
  if (auVar250._0_4_ < auVar131._0_4_) goto LAB_0130c1eb;
  auVar131 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar131._0_4_ + -0.1)));
  auVar250 = vminss_avx(ZEXT416((uint)(auVar250._0_4_ + 0.1)),auVar74);
  auVar143._0_8_ = auVar97._0_8_;
  auVar143._8_8_ = auVar143._0_8_;
  auVar218._8_8_ = local_500._0_8_;
  auVar218._0_8_ = local_500._0_8_;
  auVar232._8_8_ = auVar126._0_8_;
  auVar232._0_8_ = auVar126._0_8_;
  auVar153 = vshufpd_avx(local_500._0_16_,local_500._0_16_,3);
  auVar74 = vshufpd_avx(auVar126,auVar126,3);
  auVar241 = vshufps_avx(auVar131,auVar250,0);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar97 = vsubps_avx(auVar81,auVar241);
  local_660 = auVar6._0_4_;
  fStack_65c = auVar6._4_4_;
  fStack_658 = auVar6._8_4_;
  fStack_654 = auVar6._12_4_;
  fVar125 = auVar241._0_4_;
  auVar82._0_4_ = fVar125 * local_660;
  fVar94 = auVar241._4_4_;
  auVar82._4_4_ = fVar94 * fStack_65c;
  fVar95 = auVar241._8_4_;
  auVar82._8_4_ = fVar95 * fStack_658;
  fVar71 = auVar241._12_4_;
  auVar82._12_4_ = fVar71 * fStack_654;
  auVar176._0_4_ = fVar125 * auVar153._0_4_;
  auVar176._4_4_ = fVar94 * auVar153._4_4_;
  auVar176._8_4_ = fVar95 * auVar153._8_4_;
  auVar176._12_4_ = fVar71 * auVar153._12_4_;
  auVar188._0_4_ = fVar125 * auVar74._0_4_;
  auVar188._4_4_ = fVar94 * auVar74._4_4_;
  auVar188._8_4_ = fVar95 * auVar74._8_4_;
  auVar188._12_4_ = fVar71 * auVar74._12_4_;
  auVar203._0_4_ = fVar125 * auVar72._0_4_;
  auVar203._4_4_ = fVar94 * auVar72._4_4_;
  auVar203._8_4_ = fVar95 * auVar72._8_4_;
  auVar203._12_4_ = fVar71 * auVar72._12_4_;
  auVar153 = vfmadd231ps_fma(auVar82,auVar97,auVar143);
  auVar74 = vfmadd231ps_fma(auVar176,auVar97,auVar218);
  auVar241 = vfmadd231ps_fma(auVar188,auVar97,auVar232);
  auVar97 = vfmadd231ps_fma(auVar203,auVar97,ZEXT816(0));
  auVar6 = vmovshdup_avx(auVar75);
  auVar115 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar131._0_4_)),auVar75,
                             ZEXT416((uint)(1.0 - auVar131._0_4_)));
  auVar126 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar250._0_4_)),auVar75,
                             ZEXT416((uint)(1.0 - auVar250._0_4_)));
  fVar125 = 1.0 / fVar93;
  auVar131 = vsubps_avx(auVar74,auVar153);
  auVar219._0_4_ = auVar131._0_4_ * 3.0;
  auVar219._4_4_ = auVar131._4_4_ * 3.0;
  auVar219._8_4_ = auVar131._8_4_ * 3.0;
  auVar219._12_4_ = auVar131._12_4_ * 3.0;
  auVar131 = vsubps_avx(auVar241,auVar74);
  auVar233._0_4_ = auVar131._0_4_ * 3.0;
  auVar233._4_4_ = auVar131._4_4_ * 3.0;
  auVar233._8_4_ = auVar131._8_4_ * 3.0;
  auVar233._12_4_ = auVar131._12_4_ * 3.0;
  auVar131 = vsubps_avx(auVar97,auVar241);
  auVar242._0_4_ = auVar131._0_4_ * 3.0;
  auVar242._4_4_ = auVar131._4_4_ * 3.0;
  auVar242._8_4_ = auVar131._8_4_ * 3.0;
  auVar242._12_4_ = auVar131._12_4_ * 3.0;
  auVar6 = vminps_avx(auVar233,auVar242);
  auVar131 = vmaxps_avx(auVar233,auVar242);
  auVar6 = vminps_avx(auVar219,auVar6);
  auVar131 = vmaxps_avx(auVar219,auVar131);
  auVar72 = vshufpd_avx(auVar6,auVar6,3);
  auVar250 = vshufpd_avx(auVar131,auVar131,3);
  auVar6 = vminps_avx(auVar6,auVar72);
  auVar131 = vmaxps_avx(auVar131,auVar250);
  auVar234._0_4_ = auVar6._0_4_ * fVar125;
  auVar234._4_4_ = auVar6._4_4_ * fVar125;
  auVar234._8_4_ = auVar6._8_4_ * fVar125;
  auVar234._12_4_ = auVar6._12_4_ * fVar125;
  auVar220._0_4_ = auVar131._0_4_ * fVar125;
  auVar220._4_4_ = auVar131._4_4_ * fVar125;
  auVar220._8_4_ = auVar131._8_4_ * fVar125;
  auVar220._12_4_ = auVar131._12_4_ * fVar125;
  fVar125 = 1.0 / (auVar126._0_4_ - auVar115._0_4_);
  auVar131 = vshufpd_avx(auVar153,auVar153,3);
  auVar6 = vshufpd_avx(auVar74,auVar74,3);
  auVar72 = vshufpd_avx(auVar241,auVar241,3);
  auVar250 = vshufpd_avx(auVar97,auVar97,3);
  auVar131 = vsubps_avx(auVar131,auVar153);
  auVar75 = vsubps_avx(auVar6,auVar74);
  auVar153 = vsubps_avx(auVar72,auVar241);
  auVar250 = vsubps_avx(auVar250,auVar97);
  auVar6 = vminps_avx(auVar131,auVar75);
  auVar131 = vmaxps_avx(auVar131,auVar75);
  auVar72 = vminps_avx(auVar153,auVar250);
  auVar72 = vminps_avx(auVar6,auVar72);
  auVar6 = vmaxps_avx(auVar153,auVar250);
  auVar131 = vmaxps_avx(auVar131,auVar6);
  auVar264._0_4_ = fVar125 * auVar72._0_4_;
  auVar264._4_4_ = fVar125 * auVar72._4_4_;
  auVar264._8_4_ = fVar125 * auVar72._8_4_;
  auVar264._12_4_ = fVar125 * auVar72._12_4_;
  auVar251._0_4_ = fVar125 * auVar131._0_4_;
  auVar251._4_4_ = fVar125 * auVar131._4_4_;
  auVar251._8_4_ = fVar125 * auVar131._8_4_;
  auVar251._12_4_ = fVar125 * auVar131._12_4_;
  auVar250 = vinsertps_avx(auVar15,auVar115,0x10);
  auVar75 = vinsertps_avx(auVar16,auVar126,0x10);
  auVar243._0_4_ = (auVar250._0_4_ + auVar75._0_4_) * 0.5;
  auVar243._4_4_ = (auVar250._4_4_ + auVar75._4_4_) * 0.5;
  auVar243._8_4_ = (auVar250._8_4_ + auVar75._8_4_) * 0.5;
  auVar243._12_4_ = (auVar250._12_4_ + auVar75._12_4_) * 0.5;
  auVar83._4_4_ = auVar243._0_4_;
  auVar83._0_4_ = auVar243._0_4_;
  auVar83._8_4_ = auVar243._0_4_;
  auVar83._12_4_ = auVar243._0_4_;
  auVar131 = vfmadd213ps_fma(local_3b0,auVar83,auVar3);
  auVar6 = vfmadd213ps_fma(local_3c0,auVar83,auVar4);
  auVar72 = vfmadd213ps_fma(local_3d0,auVar83,auVar5);
  auVar16 = vsubps_avx(auVar6,auVar131);
  auVar131 = vfmadd213ps_fma(auVar16,auVar83,auVar131);
  auVar16 = vsubps_avx(auVar72,auVar6);
  auVar16 = vfmadd213ps_fma(auVar16,auVar83,auVar6);
  auVar16 = vsubps_avx(auVar16,auVar131);
  auVar131 = vfmadd231ps_fma(auVar131,auVar16,auVar83);
  auVar84._0_8_ = CONCAT44(auVar16._4_4_ * 3.0,auVar16._0_4_ * 3.0);
  auVar84._8_4_ = auVar16._8_4_ * 3.0;
  auVar84._12_4_ = auVar16._12_4_ * 3.0;
  auVar274._8_8_ = auVar131._0_8_;
  auVar274._0_8_ = auVar131._0_8_;
  auVar16 = vshufpd_avx(auVar131,auVar131,3);
  auVar131 = vshufps_avx(auVar243,auVar243,0x55);
  auVar74 = vsubps_avx(auVar16,auVar274);
  auVar97 = vfmadd231ps_fma(auVar274,auVar131,auVar74);
  auVar280._8_8_ = auVar84._0_8_;
  auVar280._0_8_ = auVar84._0_8_;
  auVar16 = vshufpd_avx(auVar84,auVar84,3);
  auVar16 = vsubps_avx(auVar16,auVar280);
  auVar241 = vfmadd213ps_fma(auVar16,auVar131,auVar280);
  auVar131 = vmovshdup_avx(auVar241);
  auVar281._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
  auVar281._8_4_ = auVar131._8_4_ ^ 0x80000000;
  auVar281._12_4_ = auVar131._12_4_ ^ 0x80000000;
  auVar6 = vmovshdup_avx(auVar74);
  auVar16 = vunpcklps_avx(auVar6,auVar281);
  auVar72 = vshufps_avx(auVar16,auVar281,4);
  auVar153 = vshufps_avx(auVar243,auVar243,0x54);
  auVar133._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
  auVar133._8_4_ = auVar74._8_4_ ^ 0x80000000;
  auVar133._12_4_ = auVar74._12_4_ ^ 0x80000000;
  auVar16 = vmovlhps_avx(auVar133,auVar241);
  auVar16 = vshufps_avx(auVar16,auVar241,8);
  auVar131 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar131._0_4_)),auVar6,auVar241);
  uVar69 = auVar131._0_4_;
  auVar85._4_4_ = uVar69;
  auVar85._0_4_ = uVar69;
  auVar85._8_4_ = uVar69;
  auVar85._12_4_ = uVar69;
  auVar131 = vdivps_avx(auVar72,auVar85);
  auVar6 = vdivps_avx(auVar16,auVar85);
  fVar95 = auVar97._0_4_;
  fVar125 = auVar131._0_4_;
  auVar16 = vshufps_avx(auVar97,auVar97,0x55);
  fVar94 = auVar6._0_4_;
  auVar86._0_4_ = fVar95 * fVar125 + auVar16._0_4_ * fVar94;
  auVar86._4_4_ = fVar95 * auVar131._4_4_ + auVar16._4_4_ * auVar6._4_4_;
  auVar86._8_4_ = fVar95 * auVar131._8_4_ + auVar16._8_4_ * auVar6._8_4_;
  auVar86._12_4_ = fVar95 * auVar131._12_4_ + auVar16._12_4_ * auVar6._12_4_;
  auVar114 = vsubps_avx(auVar153,auVar86);
  auVar153 = vmovshdup_avx(auVar131);
  auVar16 = vinsertps_avx(auVar234,auVar264,0x1c);
  auVar154._0_4_ = auVar153._0_4_ * auVar16._0_4_;
  auVar154._4_4_ = auVar153._4_4_ * auVar16._4_4_;
  auVar154._8_4_ = auVar153._8_4_ * auVar16._8_4_;
  auVar154._12_4_ = auVar153._12_4_ * auVar16._12_4_;
  auVar72 = vinsertps_avx(auVar220,auVar251,0x1c);
  auVar102._0_4_ = auVar72._0_4_ * auVar153._0_4_;
  auVar102._4_4_ = auVar72._4_4_ * auVar153._4_4_;
  auVar102._8_4_ = auVar72._8_4_ * auVar153._8_4_;
  auVar102._12_4_ = auVar72._12_4_ * auVar153._12_4_;
  auVar97 = vminps_avx(auVar154,auVar102);
  auVar241 = vmaxps_avx(auVar102,auVar154);
  auVar153 = vinsertps_avx(auVar264,auVar234,0x4c);
  auVar98 = vmovshdup_avx(auVar6);
  auVar74 = vinsertps_avx(auVar251,auVar220,0x4c);
  auVar252._0_4_ = auVar98._0_4_ * auVar153._0_4_;
  auVar252._4_4_ = auVar98._4_4_ * auVar153._4_4_;
  auVar252._8_4_ = auVar98._8_4_ * auVar153._8_4_;
  auVar252._12_4_ = auVar98._12_4_ * auVar153._12_4_;
  auVar235._0_4_ = auVar98._0_4_ * auVar74._0_4_;
  auVar235._4_4_ = auVar98._4_4_ * auVar74._4_4_;
  auVar235._8_4_ = auVar98._8_4_ * auVar74._8_4_;
  auVar235._12_4_ = auVar98._12_4_ * auVar74._12_4_;
  auVar98 = vminps_avx(auVar252,auVar235);
  auVar265._0_4_ = auVar97._0_4_ + auVar98._0_4_;
  auVar265._4_4_ = auVar97._4_4_ + auVar98._4_4_;
  auVar265._8_4_ = auVar97._8_4_ + auVar98._8_4_;
  auVar265._12_4_ = auVar97._12_4_ + auVar98._12_4_;
  auVar97 = vmaxps_avx(auVar235,auVar252);
  auVar103._0_4_ = auVar97._0_4_ + auVar241._0_4_;
  auVar103._4_4_ = auVar97._4_4_ + auVar241._4_4_;
  auVar103._8_4_ = auVar97._8_4_ + auVar241._8_4_;
  auVar103._12_4_ = auVar97._12_4_ + auVar241._12_4_;
  auVar236._8_8_ = 0x3f80000000000000;
  auVar236._0_8_ = 0x3f80000000000000;
  auVar241 = vsubps_avx(auVar236,auVar103);
  auVar97 = vsubps_avx(auVar236,auVar265);
  auVar98 = vsubps_avx(auVar250,auVar243);
  auVar128 = vsubps_avx(auVar75,auVar243);
  auVar119._0_4_ = fVar125 * auVar16._0_4_;
  auVar119._4_4_ = fVar125 * auVar16._4_4_;
  auVar119._8_4_ = fVar125 * auVar16._8_4_;
  auVar119._12_4_ = fVar125 * auVar16._12_4_;
  auVar266._0_4_ = fVar125 * auVar72._0_4_;
  auVar266._4_4_ = fVar125 * auVar72._4_4_;
  auVar266._8_4_ = fVar125 * auVar72._8_4_;
  auVar266._12_4_ = fVar125 * auVar72._12_4_;
  auVar72 = vminps_avx(auVar119,auVar266);
  auVar16 = vmaxps_avx(auVar266,auVar119);
  auVar155._0_4_ = fVar94 * auVar153._0_4_;
  auVar155._4_4_ = fVar94 * auVar153._4_4_;
  auVar155._8_4_ = fVar94 * auVar153._8_4_;
  auVar155._12_4_ = fVar94 * auVar153._12_4_;
  auVar221._0_4_ = fVar94 * auVar74._0_4_;
  auVar221._4_4_ = fVar94 * auVar74._4_4_;
  auVar221._8_4_ = fVar94 * auVar74._8_4_;
  auVar221._12_4_ = fVar94 * auVar74._12_4_;
  auVar153 = vminps_avx(auVar155,auVar221);
  auVar267._0_4_ = auVar72._0_4_ + auVar153._0_4_;
  auVar267._4_4_ = auVar72._4_4_ + auVar153._4_4_;
  auVar267._8_4_ = auVar72._8_4_ + auVar153._8_4_;
  auVar267._12_4_ = auVar72._12_4_ + auVar153._12_4_;
  fVar138 = auVar98._0_4_;
  auVar275._0_4_ = fVar138 * auVar241._0_4_;
  fVar260 = auVar98._4_4_;
  auVar275._4_4_ = fVar260 * auVar241._4_4_;
  fVar261 = auVar98._8_4_;
  auVar275._8_4_ = fVar261 * auVar241._8_4_;
  fVar193 = auVar98._12_4_;
  auVar275._12_4_ = fVar193 * auVar241._12_4_;
  auVar72 = vmaxps_avx(auVar221,auVar155);
  auVar222._0_4_ = fVar138 * auVar97._0_4_;
  auVar222._4_4_ = fVar260 * auVar97._4_4_;
  auVar222._8_4_ = fVar261 * auVar97._8_4_;
  auVar222._12_4_ = fVar193 * auVar97._12_4_;
  fVar95 = auVar128._0_4_;
  auVar104._0_4_ = fVar95 * auVar241._0_4_;
  fVar71 = auVar128._4_4_;
  auVar104._4_4_ = fVar71 * auVar241._4_4_;
  fVar162 = auVar128._8_4_;
  auVar104._8_4_ = fVar162 * auVar241._8_4_;
  fVar229 = auVar128._12_4_;
  auVar104._12_4_ = fVar229 * auVar241._12_4_;
  auVar237._0_4_ = fVar95 * auVar97._0_4_;
  auVar237._4_4_ = fVar71 * auVar97._4_4_;
  auVar237._8_4_ = fVar162 * auVar97._8_4_;
  auVar237._12_4_ = fVar229 * auVar97._12_4_;
  auVar120._0_4_ = auVar16._0_4_ + auVar72._0_4_;
  auVar120._4_4_ = auVar16._4_4_ + auVar72._4_4_;
  auVar120._8_4_ = auVar16._8_4_ + auVar72._8_4_;
  auVar120._12_4_ = auVar16._12_4_ + auVar72._12_4_;
  auVar156._8_8_ = 0x3f800000;
  auVar156._0_8_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar156,auVar120);
  auVar72 = vsubps_avx(auVar156,auVar267);
  auVar268._0_4_ = fVar138 * auVar16._0_4_;
  auVar268._4_4_ = fVar260 * auVar16._4_4_;
  auVar268._8_4_ = fVar261 * auVar16._8_4_;
  auVar268._12_4_ = fVar193 * auVar16._12_4_;
  auVar253._0_4_ = fVar138 * auVar72._0_4_;
  auVar253._4_4_ = fVar260 * auVar72._4_4_;
  auVar253._8_4_ = fVar261 * auVar72._8_4_;
  auVar253._12_4_ = fVar193 * auVar72._12_4_;
  auVar121._0_4_ = fVar95 * auVar16._0_4_;
  auVar121._4_4_ = fVar71 * auVar16._4_4_;
  auVar121._8_4_ = fVar162 * auVar16._8_4_;
  auVar121._12_4_ = fVar229 * auVar16._12_4_;
  auVar157._0_4_ = fVar95 * auVar72._0_4_;
  auVar157._4_4_ = fVar71 * auVar72._4_4_;
  auVar157._8_4_ = fVar162 * auVar72._8_4_;
  auVar157._12_4_ = fVar229 * auVar72._12_4_;
  auVar16 = vminps_avx(auVar268,auVar253);
  auVar72 = vminps_avx(auVar121,auVar157);
  auVar16 = vminps_avx(auVar16,auVar72);
  auVar72 = vmaxps_avx(auVar253,auVar268);
  auVar153 = vmaxps_avx(auVar157,auVar121);
  auVar74 = vminps_avx(auVar275,auVar222);
  auVar241 = vminps_avx(auVar104,auVar237);
  auVar74 = vminps_avx(auVar74,auVar241);
  auVar16 = vhaddps_avx(auVar16,auVar74);
  auVar72 = vmaxps_avx(auVar153,auVar72);
  auVar153 = vmaxps_avx(auVar222,auVar275);
  auVar74 = vmaxps_avx(auVar237,auVar104);
  auVar153 = vmaxps_avx(auVar74,auVar153);
  auVar72 = vhaddps_avx(auVar72,auVar153);
  auVar16 = vshufps_avx(auVar16,auVar16,0xe8);
  auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
  auVar238._0_4_ = auVar114._0_4_ + auVar16._0_4_;
  auVar238._4_4_ = auVar114._4_4_ + auVar16._4_4_;
  auVar238._8_4_ = auVar114._8_4_ + auVar16._8_4_;
  auVar238._12_4_ = auVar114._12_4_ + auVar16._12_4_;
  auVar223._0_4_ = auVar114._0_4_ + auVar72._0_4_;
  auVar223._4_4_ = auVar114._4_4_ + auVar72._4_4_;
  auVar223._8_4_ = auVar114._8_4_ + auVar72._8_4_;
  auVar223._12_4_ = auVar114._12_4_ + auVar72._12_4_;
  auVar227 = ZEXT1664(auVar223);
  auVar16 = vmaxps_avx(auVar250,auVar238);
  auVar72 = vminps_avx(auVar223,auVar75);
  auVar16 = vcmpps_avx(auVar72,auVar16,1);
  auVar16 = vshufps_avx(auVar16,auVar16,0x50);
  if ((auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar16[0xf] < '\0')
  goto LAB_0130c1eb;
  bVar64 = 0;
  if ((auVar192._0_4_ < auVar238._0_4_) && (bVar64 = 0, auVar223._0_4_ < auVar75._0_4_)) {
    auVar72 = vmovshdup_avx(auVar238);
    auVar16 = vcmpps_avx(auVar223,auVar75,1);
    bVar64 = auVar16[4] & auVar115._0_4_ < auVar72._0_4_;
  }
  if (((3 < (uint)uVar68 || fVar93 < 0.001) | bVar64) == 1) {
    lVar63 = 0xc9;
    auVar227 = ZEXT464(0x40400000);
    do {
      lVar63 = lVar63 + -1;
      if (lVar63 == 0) goto LAB_0130c1eb;
      fVar71 = auVar114._0_4_;
      fVar95 = 1.0 - fVar71;
      fVar93 = fVar95 * fVar95 * fVar95;
      fVar113 = fVar71 * 3.0 * fVar95 * fVar95;
      fVar95 = fVar95 * fVar71 * fVar71 * 3.0;
      auVar144._4_4_ = fVar93;
      auVar144._0_4_ = fVar93;
      auVar144._8_4_ = fVar93;
      auVar144._12_4_ = fVar93;
      auVar122._4_4_ = fVar113;
      auVar122._0_4_ = fVar113;
      auVar122._8_4_ = fVar113;
      auVar122._12_4_ = fVar113;
      auVar105._4_4_ = fVar95;
      auVar105._0_4_ = fVar95;
      auVar105._8_4_ = fVar95;
      auVar105._12_4_ = fVar95;
      fVar71 = fVar71 * fVar71 * fVar71;
      auVar158._0_4_ = (float)local_3e0._0_4_ * fVar71;
      auVar158._4_4_ = (float)local_3e0._4_4_ * fVar71;
      auVar158._8_4_ = fStack_3d8 * fVar71;
      auVar158._12_4_ = fStack_3d4 * fVar71;
      auVar15 = vfmadd231ps_fma(auVar158,auVar5,auVar105);
      auVar15 = vfmadd231ps_fma(auVar15,auVar4,auVar122);
      auVar15 = vfmadd231ps_fma(auVar15,auVar3,auVar144);
      auVar106._8_8_ = auVar15._0_8_;
      auVar106._0_8_ = auVar15._0_8_;
      auVar15 = vshufpd_avx(auVar15,auVar15,3);
      auVar16 = vshufps_avx(auVar114,auVar114,0x55);
      auVar15 = vsubps_avx(auVar15,auVar106);
      auVar16 = vfmadd213ps_fma(auVar15,auVar16,auVar106);
      fVar93 = auVar16._0_4_;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar107._0_4_ = fVar125 * fVar93 + fVar94 * auVar15._0_4_;
      auVar107._4_4_ = auVar131._4_4_ * fVar93 + auVar6._4_4_ * auVar15._4_4_;
      auVar107._8_4_ = auVar131._8_4_ * fVar93 + auVar6._8_4_ * auVar15._8_4_;
      auVar107._12_4_ = auVar131._12_4_ * fVar93 + auVar6._12_4_ * auVar15._12_4_;
      auVar114 = vsubps_avx(auVar114,auVar107);
      auVar15 = vandps_avx(local_3f0,auVar16);
      auVar16 = vshufps_avx(auVar15,auVar15,0xf5);
      auVar15 = vmaxss_avx(auVar16,auVar15);
    } while ((float)local_400._0_4_ <= auVar15._0_4_);
    local_120 = auVar114._0_4_;
    if ((0.0 <= local_120) && (local_120 <= 1.0)) {
      auVar15 = vmovshdup_avx(auVar114);
      fVar93 = auVar15._0_4_;
      if ((0.0 <= fVar93) && (fVar93 <= 1.0)) {
        auVar16 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar74 = vinsertps_avx(auVar16,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar16 = vdpps_avx(auVar74,local_530,0x7f);
        auVar131 = vdpps_avx(auVar74,local_540,0x7f);
        auVar6 = vdpps_avx(auVar74,local_410,0x7f);
        auVar72 = vdpps_avx(auVar74,local_420,0x7f);
        auVar250 = vdpps_avx(auVar74,local_430,0x7f);
        auVar75 = vdpps_avx(auVar74,local_440,0x7f);
        auVar153 = vdpps_avx(auVar74,local_450,0x7f);
        auVar74 = vdpps_avx(auVar74,local_460,0x7f);
        fVar113 = 1.0 - fVar93;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar250._0_4_)),ZEXT416((uint)fVar113),
                                  auVar16);
        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar93)),ZEXT416((uint)fVar113),
                                   auVar131);
        auVar227 = ZEXT1664(auVar131);
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar153._0_4_ * fVar93)),ZEXT416((uint)fVar113),
                                 auVar6);
        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar93 * auVar74._0_4_)),ZEXT416((uint)fVar113),
                                  auVar72);
        fVar95 = 1.0 - local_120;
        fVar113 = fVar95 * local_120 * local_120 * 3.0;
        fVar162 = local_120 * local_120 * local_120;
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * auVar72._0_4_)),ZEXT416((uint)fVar113),
                                 auVar6);
        fVar125 = local_120 * 3.0 * fVar95 * fVar95;
        auVar131 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar125),auVar131);
        fVar94 = fVar95 * fVar95 * fVar95;
        auVar16 = vfmadd231ss_fma(auVar131,ZEXT416((uint)fVar94),auVar16);
        fVar71 = auVar16._0_4_;
        if (((fVar70 <= fVar71) && (fVar229 = *(float *)(ray + k * 4 + 0x100), fVar71 <= fVar229))
           && (pGVar10 = (context->scene->geometries).items[uVar61].ptr,
              (pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
          auVar16 = vshufps_avx(auVar114,auVar114,0x55);
          auVar224._8_4_ = 0x3f800000;
          auVar224._0_8_ = 0x3f8000003f800000;
          auVar224._12_4_ = 0x3f800000;
          auVar131 = vsubps_avx(auVar224,auVar16);
          fVar138 = auVar16._0_4_;
          auVar239._0_4_ = fVar138 * (float)local_560._0_4_;
          fVar260 = auVar16._4_4_;
          auVar239._4_4_ = fVar260 * (float)local_560._4_4_;
          fVar261 = auVar16._8_4_;
          auVar239._8_4_ = fVar261 * fStack_558;
          fVar193 = auVar16._12_4_;
          auVar239._12_4_ = fVar193 * fStack_554;
          auVar244._0_4_ = fVar138 * (float)local_5a0._0_4_;
          auVar244._4_4_ = fVar260 * (float)local_5a0._4_4_;
          auVar244._8_4_ = fVar261 * fStack_598;
          auVar244._12_4_ = fVar193 * fStack_594;
          auVar254._0_4_ = fVar138 * (float)local_5b0._0_4_;
          auVar254._4_4_ = fVar260 * (float)local_5b0._4_4_;
          auVar254._8_4_ = fVar261 * fStack_5a8;
          auVar254._12_4_ = fVar193 * fStack_5a4;
          auVar204._0_4_ = fVar138 * fVar161;
          auVar204._4_4_ = fVar260 * fVar181;
          auVar204._8_4_ = fVar261 * fVar182;
          auVar204._12_4_ = fVar193 * fVar183;
          auVar16 = vfmadd231ps_fma(auVar239,auVar131,local_550);
          auVar6 = vfmadd231ps_fma(auVar244,auVar131,local_580);
          auVar72 = vfmadd231ps_fma(auVar254,auVar131,local_590);
          auVar250 = vfmadd231ps_fma(auVar204,auVar131,local_570);
          auVar131 = vsubps_avx(auVar6,auVar16);
          auVar227 = ZEXT1664(auVar131);
          auVar16 = vsubps_avx(auVar72,auVar6);
          auVar6 = vsubps_avx(auVar250,auVar72);
          auVar255._0_4_ = local_120 * auVar16._0_4_;
          auVar255._4_4_ = local_120 * auVar16._4_4_;
          auVar255._8_4_ = local_120 * auVar16._8_4_;
          auVar255._12_4_ = local_120 * auVar16._12_4_;
          auVar189._4_4_ = fVar95;
          auVar189._0_4_ = fVar95;
          auVar189._8_4_ = fVar95;
          auVar189._12_4_ = fVar95;
          auVar72 = vfmadd231ps_fma(auVar255,auVar189,auVar131);
          auVar205._0_4_ = local_120 * auVar6._0_4_;
          auVar205._4_4_ = local_120 * auVar6._4_4_;
          auVar205._8_4_ = local_120 * auVar6._8_4_;
          auVar205._12_4_ = local_120 * auVar6._12_4_;
          auVar16 = vfmadd231ps_fma(auVar205,auVar189,auVar16);
          auVar206._0_4_ = local_120 * auVar16._0_4_;
          auVar206._4_4_ = local_120 * auVar16._4_4_;
          auVar206._8_4_ = local_120 * auVar16._8_4_;
          auVar206._12_4_ = local_120 * auVar16._12_4_;
          auVar6 = vfmadd231ps_fma(auVar206,auVar189,auVar72);
          auVar177._0_4_ = fVar162 * (float)local_4b0._0_4_;
          auVar177._4_4_ = fVar162 * (float)local_4b0._4_4_;
          auVar177._8_4_ = fVar162 * fStack_4a8;
          auVar177._12_4_ = fVar162 * fStack_4a4;
          auVar134._4_4_ = fVar113;
          auVar134._0_4_ = fVar113;
          auVar134._8_4_ = fVar113;
          auVar134._12_4_ = fVar113;
          auVar16 = vfmadd132ps_fma(auVar134,auVar177,local_4a0);
          auVar159._4_4_ = fVar125;
          auVar159._0_4_ = fVar125;
          auVar159._8_4_ = fVar125;
          auVar159._12_4_ = fVar125;
          auVar16 = vfmadd132ps_fma(auVar159,auVar16,local_490);
          auVar178._0_4_ = auVar6._0_4_ * 3.0;
          auVar178._4_4_ = auVar6._4_4_ * 3.0;
          auVar178._8_4_ = auVar6._8_4_ * 3.0;
          auVar178._12_4_ = auVar6._12_4_ * 3.0;
          auVar145._4_4_ = fVar94;
          auVar145._0_4_ = fVar94;
          auVar145._8_4_ = fVar94;
          auVar145._12_4_ = fVar94;
          auVar6 = vfmadd132ps_fma(auVar145,auVar16,local_480);
          auVar16 = vshufps_avx(auVar178,auVar178,0xc9);
          auVar135._0_4_ = auVar6._0_4_ * auVar16._0_4_;
          auVar135._4_4_ = auVar6._4_4_ * auVar16._4_4_;
          auVar135._8_4_ = auVar6._8_4_ * auVar16._8_4_;
          auVar135._12_4_ = auVar6._12_4_ * auVar16._12_4_;
          auVar16 = vshufps_avx(auVar6,auVar6,0xc9);
          auVar16 = vfmsub231ps_fma(auVar135,auVar178,auVar16);
          local_140 = auVar16._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar71;
            uVar69 = vextractps_avx(auVar16,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar69;
            uVar69 = vextractps_avx(auVar16,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar69;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar93;
            *(uint *)(ray + k * 4 + 0x220) = uVar9;
            *(uint *)(ray + k * 4 + 0x240) = uVar61;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0130c1eb;
          }
          local_100 = auVar15._0_8_;
          auVar15 = vmovshdup_avx(auVar16);
          local_180 = auVar15._0_8_;
          auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
          local_160 = auVar15._0_8_;
          uStack_178 = local_180;
          uStack_170 = local_180;
          uStack_168 = local_180;
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          uStack_f8 = local_100;
          uStack_f0 = local_100;
          uStack_e8 = local_100;
          local_e0 = CONCAT44(uStack_35c,local_360);
          uStack_d8 = CONCAT44(uStack_354,uStack_358);
          uStack_d0 = CONCAT44(uStack_34c,uStack_350);
          uStack_c8 = CONCAT44(uStack_344,uStack_348);
          local_c0._4_4_ = uStack_33c;
          local_c0._0_4_ = local_340;
          local_c0._8_4_ = uStack_338;
          local_c0._12_4_ = uStack_334;
          local_c0._16_4_ = uStack_330;
          local_c0._20_4_ = uStack_32c;
          local_c0._24_4_ = uStack_328;
          local_c0._28_4_ = uStack_324;
          vpcmpeqd_avx2(local_c0,local_c0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar71;
          local_4e0 = local_380;
          local_610.valid = (int *)local_4e0;
          local_610.geometryUserPtr = pGVar10->userPtr;
          local_610.context = context->user;
          local_610.hit = (RTCHitN *)&local_180;
          local_610.N = 8;
          local_610.ray = (RTCRayN *)ray;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar227 = ZEXT1664(auVar131);
            (*pGVar10->intersectionFilterN)(&local_610);
          }
          auVar87 = vpcmpeqd_avx2(local_4e0,_DAT_01f7b000);
          auVar87 = _DAT_01f7b020 & ~auVar87;
          if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0x7f,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar87 >> 0xbf,0) != '\0') ||
              (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar87[0x1f] < '\0') {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              auVar227 = ZEXT1664(auVar227._0_16_);
              (*p_Var11)(&local_610);
            }
            auVar17 = vpcmpeqd_avx2(local_4e0,_DAT_01f7b000);
            auVar87 = _DAT_01f7b020 & ~auVar17;
            if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0x7f,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0xbf,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar87[0x1f] < '\0') {
              auVar90._0_8_ = auVar17._0_8_ ^ 0xffffffffffffffff;
              auVar90._8_4_ = auVar17._8_4_ ^ 0xffffffff;
              auVar90._12_4_ = auVar17._12_4_ ^ 0xffffffff;
              auVar90._16_4_ = auVar17._16_4_ ^ 0xffffffff;
              auVar90._20_4_ = auVar17._20_4_ ^ 0xffffffff;
              auVar90._24_4_ = auVar17._24_4_ ^ 0xffffffff;
              auVar90._28_4_ = auVar17._28_4_ ^ 0xffffffff;
              auVar87 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])local_610.hit);
              *(undefined1 (*) [32])(local_610.ray + 0x180) = auVar87;
              auVar87 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])(local_610.hit + 0x20));
              *(undefined1 (*) [32])(local_610.ray + 0x1a0) = auVar87;
              auVar87 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])(local_610.hit + 0x40));
              *(undefined1 (*) [32])(local_610.ray + 0x1c0) = auVar87;
              auVar87 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])(local_610.hit + 0x60));
              *(undefined1 (*) [32])(local_610.ray + 0x1e0) = auVar87;
              auVar87 = vmaskmovps_avx(auVar90,*(undefined1 (*) [32])(local_610.hit + 0x80));
              *(undefined1 (*) [32])(local_610.ray + 0x200) = auVar87;
              auVar87 = vpmaskmovd_avx2(auVar90,*(undefined1 (*) [32])(local_610.hit + 0xa0));
              *(undefined1 (*) [32])(local_610.ray + 0x220) = auVar87;
              auVar87 = vpmaskmovd_avx2(auVar90,*(undefined1 (*) [32])(local_610.hit + 0xc0));
              *(undefined1 (*) [32])(local_610.ray + 0x240) = auVar87;
              auVar87 = vpmaskmovd_avx2(auVar90,*(undefined1 (*) [32])(local_610.hit + 0xe0));
              *(undefined1 (*) [32])(local_610.ray + 0x260) = auVar87;
              auVar87 = vpmaskmovd_avx2(auVar90,*(undefined1 (*) [32])(local_610.hit + 0x100));
              *(undefined1 (*) [32])(local_610.ray + 0x280) = auVar87;
              goto LAB_0130c1eb;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar229;
        }
      }
    }
    goto LAB_0130c1eb;
  }
  local_470 = vinsertps_avx(auVar15,ZEXT416((uint)fVar113),0x10);
  auVar75 = vinsertps_avx(auVar115,ZEXT416((uint)auVar126._0_4_),0x10);
  goto LAB_0130b9a9;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }